

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersector1<8>::
     occluded_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  long lVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  long lVar35;
  ulong uVar36;
  uint uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar64 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  int iVar105;
  undefined4 uVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  vfloat4 a0;
  undefined1 auVar112 [16];
  float fVar113;
  vfloat4 a0_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar121;
  vfloat4 b0;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  __m128 a;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar167;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  vfloat4 a0_2;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar209;
  float fVar210;
  vfloat4 b0_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar211;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  vfloat4 a0_3;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_33c;
  undefined1 local_338 [16];
  ulong local_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  long local_270;
  ulong local_268;
  Primitive *local_260;
  RTCFilterFunctionNArguments local_258;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  uint auStack_188 [4];
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_16c;
  undefined4 local_164;
  undefined4 local_160;
  uint local_15c;
  uint local_158;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined8 uStack_b8;
  undefined1 local_98 [32];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar29;
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar231 [32];
  
  PVar5 = prim[1];
  uVar28 = (ulong)(byte)PVar5;
  lVar35 = uVar28 * 0x25;
  fVar214 = *(float *)(prim + lVar35 + 0x12);
  auVar86._16_16_ =
       vsubps_avx((undefined1  [16])(ray->org).field_0,*(undefined1 (*) [16])(prim + lVar35 + 6));
  fVar113 = fVar214 * (ray->dir).field_0.m128[0];
  fVar121 = fVar214 * auVar86._16_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar28 * 4 + 6);
  auVar69 = vpmovsxbd_avx2(auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar28 * 5 + 6);
  auVar68 = vpmovsxbd_avx2(auVar43);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar28 * 6 + 6);
  auVar78 = vpmovsxbd_avx2(auVar56);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar28 * 0xf + 6);
  auVar89 = vpmovsxbd_avx2(auVar57);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar83 = vpmovsxbd_avx2(auVar61);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90 = vcvtdq2ps_avx(auVar83);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar28 + 6);
  auVar79 = vpmovsxbd_avx2(auVar60);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar28 * 0x1a + 6);
  auVar80 = vpmovsxbd_avx2(auVar62);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar28 * 0x1b + 6);
  auVar81 = vpmovsxbd_avx2(auVar63);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar28 * 0x1c + 6);
  auVar82 = vpmovsxbd_avx2(auVar44);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar93._4_4_ = fVar113;
  auVar93._0_4_ = fVar113;
  auVar93._8_4_ = fVar113;
  auVar93._12_4_ = fVar113;
  auVar93._16_4_ = fVar113;
  auVar93._20_4_ = fVar113;
  auVar93._24_4_ = fVar113;
  auVar93._28_4_ = fVar113;
  auVar240._8_4_ = 1;
  auVar240._0_8_ = 0x100000001;
  auVar240._12_4_ = 1;
  auVar240._16_4_ = 1;
  auVar240._20_4_ = 1;
  auVar240._24_4_ = 1;
  auVar240._28_4_ = 1;
  auVar65 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar241 = ZEXT3264(auVar65);
  auVar67 = ZEXT1632(CONCAT412(fVar214 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar214 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar214 * (ray->dir).field_0.m128[1],fVar113))));
  auVar84 = vpermps_avx2(auVar240,auVar67);
  auVar66 = vpermps_avx512vl(auVar65,auVar67);
  fVar198 = auVar66._0_4_;
  auVar91._0_4_ = fVar198 * auVar78._0_4_;
  fVar209 = auVar66._4_4_;
  auVar91._4_4_ = fVar209 * auVar78._4_4_;
  fVar210 = auVar66._8_4_;
  auVar91._8_4_ = fVar210 * auVar78._8_4_;
  fVar211 = auVar66._12_4_;
  auVar91._12_4_ = fVar211 * auVar78._12_4_;
  fVar212 = auVar66._16_4_;
  auVar91._16_4_ = fVar212 * auVar78._16_4_;
  fVar213 = auVar66._20_4_;
  auVar91._20_4_ = fVar213 * auVar78._20_4_;
  fVar111 = auVar66._24_4_;
  auVar91._24_4_ = fVar111 * auVar78._24_4_;
  auVar91._28_4_ = 0;
  auVar67._4_4_ = auVar79._4_4_ * fVar209;
  auVar67._0_4_ = auVar79._0_4_ * fVar198;
  auVar67._8_4_ = auVar79._8_4_ * fVar210;
  auVar67._12_4_ = auVar79._12_4_ * fVar211;
  auVar67._16_4_ = auVar79._16_4_ * fVar212;
  auVar67._20_4_ = auVar79._20_4_ * fVar213;
  auVar67._24_4_ = auVar79._24_4_ * fVar111;
  auVar67._28_4_ = auVar83._28_4_;
  auVar83._4_4_ = auVar82._4_4_ * fVar209;
  auVar83._0_4_ = auVar82._0_4_ * fVar198;
  auVar83._8_4_ = auVar82._8_4_ * fVar210;
  auVar83._12_4_ = auVar82._12_4_ * fVar211;
  auVar83._16_4_ = auVar82._16_4_ * fVar212;
  auVar83._20_4_ = auVar82._20_4_ * fVar213;
  auVar83._24_4_ = auVar82._24_4_ * fVar111;
  auVar83._28_4_ = auVar66._28_4_;
  auVar42 = vfmadd231ps_fma(auVar91,auVar84,auVar68);
  auVar43 = vfmadd231ps_fma(auVar67,auVar84,auVar90);
  auVar56 = vfmadd231ps_fma(auVar83,auVar81,auVar84);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar93,auVar69);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar93,auVar89);
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar80,auVar93);
  auVar230._4_4_ = fVar121;
  auVar230._0_4_ = fVar121;
  auVar230._8_4_ = fVar121;
  auVar230._12_4_ = fVar121;
  auVar230._16_4_ = fVar121;
  auVar230._20_4_ = fVar121;
  auVar230._24_4_ = fVar121;
  auVar230._28_4_ = fVar121;
  auVar84 = ZEXT1632(CONCAT412(fVar214 * auVar86._28_4_,
                               CONCAT48(fVar214 * auVar86._24_4_,
                                        CONCAT44(fVar214 * auVar86._20_4_,fVar121))));
  auVar83 = vpermps_avx2(auVar240,auVar84);
  auVar67 = vpermps_avx512vl(auVar65,auVar84);
  fVar214 = auVar67._0_4_;
  fVar198 = auVar67._4_4_;
  auVar84._4_4_ = fVar198 * auVar78._4_4_;
  auVar84._0_4_ = fVar214 * auVar78._0_4_;
  fVar209 = auVar67._8_4_;
  auVar84._8_4_ = fVar209 * auVar78._8_4_;
  fVar210 = auVar67._12_4_;
  auVar84._12_4_ = fVar210 * auVar78._12_4_;
  fVar211 = auVar67._16_4_;
  auVar84._16_4_ = fVar211 * auVar78._16_4_;
  fVar212 = auVar67._20_4_;
  auVar84._20_4_ = fVar212 * auVar78._20_4_;
  fVar213 = auVar67._24_4_;
  auVar84._24_4_ = fVar213 * auVar78._24_4_;
  auVar84._28_4_ = fVar113;
  auVar65._4_4_ = auVar79._4_4_ * fVar198;
  auVar65._0_4_ = auVar79._0_4_ * fVar214;
  auVar65._8_4_ = auVar79._8_4_ * fVar209;
  auVar65._12_4_ = auVar79._12_4_ * fVar210;
  auVar65._16_4_ = auVar79._16_4_ * fVar211;
  auVar65._20_4_ = auVar79._20_4_ * fVar212;
  auVar65._24_4_ = auVar79._24_4_ * fVar213;
  auVar65._28_4_ = auVar78._28_4_;
  auVar79._4_4_ = auVar82._4_4_ * fVar198;
  auVar79._0_4_ = auVar82._0_4_ * fVar214;
  auVar79._8_4_ = auVar82._8_4_ * fVar209;
  auVar79._12_4_ = auVar82._12_4_ * fVar210;
  auVar79._16_4_ = auVar82._16_4_ * fVar211;
  auVar79._20_4_ = auVar82._20_4_ * fVar212;
  auVar79._24_4_ = auVar82._24_4_ * fVar213;
  auVar79._28_4_ = auVar67._28_4_;
  auVar57 = vfmadd231ps_fma(auVar84,auVar83,auVar68);
  auVar61 = vfmadd231ps_fma(auVar65,auVar83,auVar90);
  auVar60 = vfmadd231ps_fma(auVar79,auVar83,auVar81);
  auVar86._16_16_ = vfmadd231ps_fma(ZEXT1632(auVar57),auVar230,auVar69);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar230,auVar89);
  auVar131._8_4_ = 0x7fffffff;
  auVar131._0_8_ = 0x7fffffff7fffffff;
  auVar131._12_4_ = 0x7fffffff;
  auVar131._16_4_ = 0x7fffffff;
  auVar131._20_4_ = 0x7fffffff;
  auVar131._24_4_ = 0x7fffffff;
  auVar131._28_4_ = 0x7fffffff;
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar230,auVar80);
  auVar69 = vandps_avx(ZEXT1632(auVar42),auVar131);
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  auVar176._16_4_ = 0x219392ef;
  auVar176._20_4_ = 0x219392ef;
  auVar176._24_4_ = 0x219392ef;
  auVar176._28_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar69,auVar176,1);
  bVar34 = (bool)((byte)uVar36 & 1);
  auVar66._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar42._0_4_;
  bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar42._4_4_;
  bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar42._8_4_;
  bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar42._12_4_;
  auVar66._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar66._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar66._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar66._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar69 = vandps_avx(ZEXT1632(auVar43),auVar131);
  uVar36 = vcmpps_avx512vl(auVar69,auVar176,1);
  bVar34 = (bool)((byte)uVar36 & 1);
  auVar85._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar43._0_4_;
  bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar43._4_4_;
  bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar43._8_4_;
  bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar43._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar69 = vandps_avx(ZEXT1632(auVar56),auVar131);
  uVar36 = vcmpps_avx512vl(auVar69,auVar176,1);
  bVar34 = (bool)((byte)uVar36 & 1);
  auVar69._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar56._0_4_;
  bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar56._4_4_;
  bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar56._8_4_;
  bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar56._12_4_;
  auVar69._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar69._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar69._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar69._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar68 = vrcp14ps_avx512vl(auVar66);
  auVar165._8_4_ = 0x3f800000;
  auVar165._0_8_ = 0x3f8000003f800000;
  auVar165._12_4_ = 0x3f800000;
  auVar165._16_4_ = 0x3f800000;
  auVar165._20_4_ = 0x3f800000;
  auVar165._24_4_ = 0x3f800000;
  auVar165._28_4_ = 0x3f800000;
  auVar42 = vfnmadd213ps_fma(auVar66,auVar68,auVar165);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar85);
  auVar43 = vfnmadd213ps_fma(auVar85,auVar68,auVar165);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar69);
  auVar56 = vfnmadd213ps_fma(auVar69,auVar68,auVar165);
  auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar68,auVar68);
  fVar214 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar35 + 0x16)) *
            *(float *)(prim + lVar35 + 0x1a);
  auVar145._4_4_ = fVar214;
  auVar145._0_4_ = fVar214;
  auVar145._8_4_ = fVar214;
  auVar145._12_4_ = fVar214;
  auVar145._16_4_ = fVar214;
  auVar145._20_4_ = fVar214;
  auVar145._24_4_ = fVar214;
  auVar145._28_4_ = fVar214;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 7 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0xb + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar78 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 9 + 6));
  auVar57 = vfmadd213ps_fma(auVar68,auVar145,auVar69);
  auVar69 = vcvtdq2ps_avx(auVar78);
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0xd + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar61 = vfmadd213ps_fma(auVar68,auVar145,auVar69);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x12 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar36 = (ulong)(uint)((int)(uVar28 * 5) << 2);
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 2 + uVar36 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar60 = vfmadd213ps_fma(auVar68,auVar145,auVar69);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x18 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar62 = vfmadd213ps_fma(auVar68,auVar145,auVar69);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x1d + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 + (ulong)(byte)PVar5 * 0x20 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar63 = vfmadd213ps_fma(auVar68,auVar145,auVar69);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar5 * 0x20 - uVar28) + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x23 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar69);
  auVar44 = vfmadd213ps_fma(auVar68,auVar145,auVar69);
  auVar69 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar86._16_16_));
  auVar80._4_4_ = auVar42._4_4_ * auVar69._4_4_;
  auVar80._0_4_ = auVar42._0_4_ * auVar69._0_4_;
  auVar80._8_4_ = auVar42._8_4_ * auVar69._8_4_;
  auVar80._12_4_ = auVar42._12_4_ * auVar69._12_4_;
  auVar80._16_4_ = auVar69._16_4_ * 0.0;
  auVar80._20_4_ = auVar69._20_4_ * 0.0;
  auVar80._24_4_ = auVar69._24_4_ * 0.0;
  auVar80._28_4_ = auVar69._28_4_;
  auVar69 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar86._16_16_));
  auVar92._0_4_ = auVar42._0_4_ * auVar69._0_4_;
  auVar92._4_4_ = auVar42._4_4_ * auVar69._4_4_;
  auVar92._8_4_ = auVar42._8_4_ * auVar69._8_4_;
  auVar92._12_4_ = auVar42._12_4_ * auVar69._12_4_;
  auVar92._16_4_ = auVar69._16_4_ * 0.0;
  auVar92._20_4_ = auVar69._20_4_ * 0.0;
  auVar92._24_4_ = auVar69._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar69 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar47));
  auVar81._4_4_ = auVar43._4_4_ * auVar69._4_4_;
  auVar81._0_4_ = auVar43._0_4_ * auVar69._0_4_;
  auVar81._8_4_ = auVar43._8_4_ * auVar69._8_4_;
  auVar81._12_4_ = auVar43._12_4_ * auVar69._12_4_;
  auVar81._16_4_ = auVar69._16_4_ * 0.0;
  auVar81._20_4_ = auVar69._20_4_ * 0.0;
  auVar81._24_4_ = auVar69._24_4_ * 0.0;
  auVar81._28_4_ = auVar69._28_4_;
  auVar69 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar47));
  auVar88._0_4_ = auVar43._0_4_ * auVar69._0_4_;
  auVar88._4_4_ = auVar43._4_4_ * auVar69._4_4_;
  auVar88._8_4_ = auVar43._8_4_ * auVar69._8_4_;
  auVar88._12_4_ = auVar43._12_4_ * auVar69._12_4_;
  auVar88._16_4_ = auVar69._16_4_ * 0.0;
  auVar88._20_4_ = auVar69._20_4_ * 0.0;
  auVar88._24_4_ = auVar69._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar69 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar45));
  auVar82._4_4_ = auVar56._4_4_ * auVar69._4_4_;
  auVar82._0_4_ = auVar56._0_4_ * auVar69._0_4_;
  auVar82._8_4_ = auVar56._8_4_ * auVar69._8_4_;
  auVar82._12_4_ = auVar56._12_4_ * auVar69._12_4_;
  auVar82._16_4_ = auVar69._16_4_ * 0.0;
  auVar82._20_4_ = auVar69._20_4_ * 0.0;
  auVar82._24_4_ = auVar69._24_4_ * 0.0;
  auVar82._28_4_ = auVar69._28_4_;
  auVar69 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar45));
  auVar87._0_4_ = auVar56._0_4_ * auVar69._0_4_;
  auVar87._4_4_ = auVar56._4_4_ * auVar69._4_4_;
  auVar87._8_4_ = auVar56._8_4_ * auVar69._8_4_;
  auVar87._12_4_ = auVar56._12_4_ * auVar69._12_4_;
  auVar87._16_4_ = auVar69._16_4_ * 0.0;
  auVar87._20_4_ = auVar69._20_4_ * 0.0;
  auVar87._24_4_ = auVar69._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar69 = vpminsd_avx2(auVar80,auVar92);
  auVar68 = vpminsd_avx2(auVar81,auVar88);
  auVar69 = vmaxps_avx(auVar69,auVar68);
  auVar68 = vpminsd_avx2(auVar82,auVar87);
  uVar106 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar78._4_4_ = uVar106;
  auVar78._0_4_ = uVar106;
  auVar78._8_4_ = uVar106;
  auVar78._12_4_ = uVar106;
  auVar78._16_4_ = uVar106;
  auVar78._20_4_ = uVar106;
  auVar78._24_4_ = uVar106;
  auVar78._28_4_ = uVar106;
  auVar68 = vmaxps_avx512vl(auVar68,auVar78);
  auVar69 = vmaxps_avx(auVar69,auVar68);
  auVar68._8_4_ = 0x3f7ffffa;
  auVar68._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar68._12_4_ = 0x3f7ffffa;
  auVar68._16_4_ = 0x3f7ffffa;
  auVar68._20_4_ = 0x3f7ffffa;
  auVar68._24_4_ = 0x3f7ffffa;
  auVar68._28_4_ = 0x3f7ffffa;
  local_98 = vmulps_avx512vl(auVar69,auVar68);
  auVar69 = vpmaxsd_avx2(auVar80,auVar92);
  auVar68 = vpmaxsd_avx2(auVar81,auVar88);
  auVar69 = vminps_avx(auVar69,auVar68);
  auVar68 = vpmaxsd_avx2(auVar82,auVar87);
  fVar214 = ray->tfar;
  auVar89._4_4_ = fVar214;
  auVar89._0_4_ = fVar214;
  auVar89._8_4_ = fVar214;
  auVar89._12_4_ = fVar214;
  auVar89._16_4_ = fVar214;
  auVar89._20_4_ = fVar214;
  auVar89._24_4_ = fVar214;
  auVar89._28_4_ = fVar214;
  auVar68 = vminps_avx512vl(auVar68,auVar89);
  auVar69 = vminps_avx(auVar69,auVar68);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar69 = vmulps_avx512vl(auVar69,auVar90);
  auVar68 = vpbroadcastd_avx512vl();
  uVar14 = vpcmpgtd_avx512vl(auVar68,_DAT_01fe9900);
  uVar13 = vcmpps_avx512vl(local_98,auVar69,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) == 0) {
    return false;
  }
  uVar36 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  auVar86._16_16_ = auVar68._16_16_;
  auVar42 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar242 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar247 = ZEXT1664(auVar42);
  local_260 = prim;
LAB_01e53fff:
  lVar35 = 0;
  for (uVar28 = uVar36; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar35 = lVar35 + 1;
  }
  local_320 = (ulong)*(uint *)(local_260 + 2);
  pGVar6 = (context->scene->geometries).items[local_320].ptr;
  fVar214 = (pGVar6->time_range).lower;
  local_268 = (ulong)*(uint *)(local_260 + lVar35 * 4 + 6);
  fVar214 = pGVar6->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar214) / ((pGVar6->time_range).upper - fVar214));
  auVar42 = vroundss_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),9);
  auVar43 = vaddss_avx512f(ZEXT416((uint)pGVar6->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar42 = vminss_avx(auVar42,auVar43);
  auVar44 = vmaxss_avx512f(auVar242._0_16_,auVar42);
  uVar28 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_268 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar32 = (long)(int)auVar44._0_4_ * 0x38;
  lVar30 = *(long *)(_Var7 + 0x10 + lVar32);
  auVar42 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar32) + lVar30 * uVar28);
  lVar35 = uVar28 + 1;
  auVar43 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar32) + lVar30 * lVar35);
  lVar30 = *(long *)&pGVar6[4].fnumTimeSegments;
  lVar8 = *(long *)(lVar30 + 0x10 + lVar32);
  auVar56 = *(undefined1 (*) [16])(*(long *)(lVar30 + lVar32) + lVar8 * uVar28);
  p_Var9 = pGVar6[4].occlusionFilterN;
  auVar57 = *(undefined1 (*) [16])(*(long *)(lVar30 + lVar32) + lVar8 * lVar35);
  _Var10 = pGVar6[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar8 = *(long *)(_Var10 + 0x10 + lVar32);
  lVar11 = *(long *)(_Var7 + 0x38 + lVar32);
  lVar12 = *(long *)(_Var7 + 0x48 + lVar32);
  auVar61 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar28);
  auVar60 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar35);
  lVar11 = *(long *)(lVar30 + 0x38 + lVar32);
  lVar30 = *(long *)(lVar30 + 0x48 + lVar32);
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar30 * uVar28);
  auVar63 = *(undefined1 (*) [16])(lVar11 + lVar30 * lVar35);
  lVar30 = *(long *)(_Var10 + 0x38 + lVar32);
  lVar11 = *(long *)(_Var10 + 0x48 + lVar32);
  auVar45 = vsubss_avx512f(ZEXT416((uint)fVar214),auVar44);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar44 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar32) + *(long *)(p_Var9 + lVar32 + 0x10) * uVar28),
                       auVar42,auVar46);
  auVar47 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar32) + *(long *)(p_Var9 + lVar32 + 0x10) * lVar35),
                       auVar43,auVar46);
  auVar48 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var10 + lVar32) + lVar8 * uVar28),auVar56,
                       auVar46);
  auVar49 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var10 + lVar32) + lVar8 * lVar35),auVar57,
                       auVar46);
  auVar71._0_16_ = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
  auVar50 = vmulps_avx512vl(auVar43,auVar71._0_16_);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar47,auVar71._0_16_);
  auVar51 = vxorps_avx512vl(auVar241._0_16_,auVar241._0_16_);
  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar44,auVar50);
  auVar51 = vaddps_avx512vl(auVar42,auVar51);
  auVar64 = auVar247._0_16_;
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar44,auVar64);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar42,auVar64);
  auVar52 = vmulps_avx512vl(auVar57,auVar71._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar49,auVar71._0_16_);
  auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar53 = vfmadd213ps_avx512vl(auVar53,auVar48,auVar52);
  auVar54 = vaddps_avx512vl(auVar56,auVar53);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar48,auVar64);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar56,auVar64);
  auVar53 = vxorps_avx512vl(auVar53,auVar53);
  auVar53 = vfmadd213ps_avx512vl(auVar53,auVar47,auVar43);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar44,auVar71._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar42,auVar71._0_16_);
  auVar43 = vmulps_avx512vl(auVar43,auVar64);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar64,auVar47);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar71._0_16_,auVar44);
  auVar55 = vfnmadd231ps_avx512vl(auVar43,auVar71._0_16_,auVar42);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar49,auVar57);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar48,auVar71._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar56,auVar71._0_16_);
  auVar42 = vmulps_avx512vl(auVar57,auVar64);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar64,auVar49);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar71._0_16_,auVar48);
  auVar47 = vfnmadd231ps_avx512vl(auVar42,auVar71._0_16_,auVar56);
  auVar42 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar56 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  fVar211 = auVar50._0_4_;
  auVar58._0_4_ = fVar211 * auVar56._0_4_;
  fVar212 = auVar50._4_4_;
  auVar58._4_4_ = fVar212 * auVar56._4_4_;
  fVar213 = auVar50._8_4_;
  auVar58._8_4_ = fVar213 * auVar56._8_4_;
  fVar111 = auVar50._12_4_;
  auVar58._12_4_ = fVar111 * auVar56._12_4_;
  auVar56 = vfmsub231ps_avx512vl(auVar58,auVar42,auVar54);
  auVar56 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar57 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar148._0_4_ = fVar211 * auVar57._0_4_;
  auVar148._4_4_ = fVar212 * auVar57._4_4_;
  auVar148._8_4_ = fVar213 * auVar57._8_4_;
  auVar148._12_4_ = fVar111 * auVar57._12_4_;
  auVar42 = vfmsub231ps_avx512vl(auVar148,auVar42,auVar52);
  auVar57 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar48 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar42 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar42 = vmulps_avx512vl(auVar55,auVar42);
  auVar42 = vfmsub231ps_fma(auVar42,auVar48,auVar43);
  auVar44 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar42 = vmulps_avx512vl(auVar55,auVar42);
  auVar42 = vfmsub231ps_fma(auVar42,auVar48,auVar47);
  auVar47 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar56,auVar56,0x7f);
  auVar71._16_16_ = auVar86._16_16_;
  auVar70._4_28_ = auVar71._4_28_;
  auVar70._0_4_ = auVar42._0_4_;
  auVar43 = vrsqrt14ss_avx512f(auVar71._0_16_,auVar70._0_16_);
  auVar48 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar49 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  auVar49 = vmulss_avx512f(auVar49,auVar43);
  auVar43 = vmulss_avx512f(auVar49,ZEXT416((uint)(auVar43._0_4_ * auVar43._0_4_)));
  fVar209 = auVar48._0_4_ - auVar43._0_4_;
  auVar43 = vdpps_avx(auVar56,auVar57,0x7f);
  auVar168._4_4_ = fVar209;
  auVar168._0_4_ = fVar209;
  auVar168._8_4_ = fVar209;
  auVar168._12_4_ = fVar209;
  auVar48 = vmulps_avx512vl(auVar56,auVar168);
  auVar49 = vbroadcastss_avx512vl(auVar42);
  auVar57 = vmulps_avx512vl(auVar49,auVar57);
  fVar214 = auVar43._0_4_;
  auVar133._0_4_ = fVar214 * auVar56._0_4_;
  auVar133._4_4_ = fVar214 * auVar56._4_4_;
  auVar133._8_4_ = fVar214 * auVar56._8_4_;
  auVar133._12_4_ = fVar214 * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar57,auVar133);
  auVar43 = vrcp14ss_avx512f(auVar71._0_16_,auVar70._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar43,ZEXT416(0x40000000));
  fVar214 = auVar43._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar44,auVar44,0x7f);
  auVar73._16_16_ = auVar86._16_16_;
  auVar73._0_16_ = auVar71._0_16_;
  auVar72._4_28_ = auVar73._4_28_;
  auVar72._0_4_ = auVar42._0_4_;
  auVar43 = vrsqrt14ss_avx512f(auVar71._0_16_,auVar72._0_16_);
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar49 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  fVar198 = auVar43._0_4_;
  fVar210 = auVar57._0_4_ - auVar49._0_4_ * fVar198 * fVar198 * fVar198;
  auVar43 = vdpps_avx(auVar44,auVar47,0x7f);
  auVar178._0_4_ = auVar44._0_4_ * fVar210;
  auVar178._4_4_ = auVar44._4_4_ * fVar210;
  auVar178._8_4_ = auVar44._8_4_ * fVar210;
  auVar178._12_4_ = auVar44._12_4_ * fVar210;
  auVar57 = vbroadcastss_avx512vl(auVar42);
  auVar57 = vmulps_avx512vl(auVar57,auVar47);
  fVar198 = auVar43._0_4_;
  auVar49._0_4_ = fVar198 * auVar44._0_4_;
  auVar49._4_4_ = fVar198 * auVar44._4_4_;
  auVar49._8_4_ = fVar198 * auVar44._8_4_;
  auVar49._12_4_ = fVar198 * auVar44._12_4_;
  auVar43 = vsubps_avx(auVar57,auVar49);
  auVar57 = vrcp14ss_avx512f(auVar71._0_16_,auVar72._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar57,ZEXT416(0x40000000));
  fVar198 = auVar57._0_4_ * auVar42._0_4_;
  auVar57 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar44 = vmulps_avx512vl(auVar57,auVar48);
  auVar49 = vsubps_avx512vl(auVar51,auVar44);
  auVar42 = vshufps_avx(auVar50,auVar50,0xff);
  auVar42 = vmulps_avx512vl(auVar42,auVar48);
  auVar134._0_4_ = auVar42._0_4_ + auVar57._0_4_ * fVar209 * fVar214 * auVar56._0_4_;
  auVar134._4_4_ = auVar42._4_4_ + auVar57._4_4_ * fVar209 * fVar214 * auVar56._4_4_;
  auVar134._8_4_ = auVar42._8_4_ + auVar57._8_4_ * fVar209 * fVar214 * auVar56._8_4_;
  auVar134._12_4_ = auVar42._12_4_ + auVar57._12_4_ * fVar209 * fVar214 * auVar56._12_4_;
  auVar42 = vsubps_avx(auVar50,auVar134);
  auVar48 = vaddps_avx512vl(auVar51,auVar44);
  auVar135._0_4_ = fVar211 + auVar134._0_4_;
  auVar135._4_4_ = fVar212 + auVar134._4_4_;
  auVar135._8_4_ = fVar213 + auVar134._8_4_;
  auVar135._12_4_ = fVar111 + auVar134._12_4_;
  auVar56 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar169._0_4_ = auVar178._0_4_ * auVar56._0_4_;
  auVar169._4_4_ = auVar178._4_4_ * auVar56._4_4_;
  auVar169._8_4_ = auVar178._8_4_ * auVar56._8_4_;
  auVar169._12_4_ = auVar178._12_4_ * auVar56._12_4_;
  auVar50 = vsubps_avx512vl(auVar53,auVar169);
  auVar57 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar44 = vmulps_avx512vl(auVar57,auVar178);
  auVar149._0_4_ = auVar44._0_4_ + auVar56._0_4_ * fVar210 * auVar43._0_4_ * fVar198;
  auVar149._4_4_ = auVar44._4_4_ + auVar56._4_4_ * fVar210 * auVar43._4_4_ * fVar198;
  auVar149._8_4_ = auVar44._8_4_ + auVar56._8_4_ * fVar210 * auVar43._8_4_ * fVar198;
  auVar149._12_4_ = auVar44._12_4_ + auVar56._12_4_ * fVar210 * auVar43._12_4_ * fVar198;
  auVar43 = vsubps_avx512vl(auVar55,auVar149);
  auVar51 = vaddps_avx512vl(auVar53,auVar169);
  auVar56 = vaddps_avx512vl(auVar55,auVar149);
  auVar42 = vmulps_avx512vl(auVar42,auVar46);
  auVar158._0_4_ = auVar49._0_4_ + auVar42._0_4_;
  auVar158._4_4_ = auVar49._4_4_ + auVar42._4_4_;
  auVar158._8_4_ = auVar49._8_4_ + auVar42._8_4_;
  auVar158._12_4_ = auVar49._12_4_ + auVar42._12_4_;
  auVar42 = vmulps_avx512vl(auVar43,auVar46);
  auVar44 = vsubps_avx(auVar50,auVar42);
  auVar42 = vmulps_avx512vl(auVar135,auVar46);
  auVar52 = vaddps_avx512vl(auVar48,auVar42);
  auVar42 = vmulps_avx512vl(auVar56,auVar46);
  auVar47 = vsubps_avx(auVar51,auVar42);
  auVar42 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar32 + 0x38) +
                        *(long *)(p_Var9 + lVar32 + 0x48) * uVar28),auVar61,auVar46);
  auVar43 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar32 + 0x38) +
                        *(long *)(p_Var9 + lVar32 + 0x48) * lVar35),auVar60,auVar46);
  auVar56 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar30 + uVar28 * lVar11),auVar62,auVar46);
  auVar54 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar30 + lVar11 * lVar35),auVar63,auVar46);
  auVar55 = vmulps_avx512vl(auVar60,auVar71._0_16_);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar43,auVar71._0_16_);
  auVar57 = vxorps_avx512vl(auVar57,auVar57);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar42,auVar55);
  auVar58 = vaddps_avx512vl(auVar61,auVar57);
  auVar57 = vfmadd231ps_avx512vl(auVar55,auVar42,auVar64);
  auVar55 = vfnmadd231ps_avx512vl(auVar57,auVar61,auVar64);
  auVar57 = vmulps_avx512vl(auVar63,auVar71._0_16_);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar54,auVar71._0_16_);
  auVar53 = vxorps_avx512vl(auVar53,auVar53);
  auVar53 = vfmadd213ps_avx512vl(auVar53,auVar56,auVar57);
  auVar59 = vaddps_avx512vl(auVar62,auVar53);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar64);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar62,auVar64);
  auVar53 = vxorps_avx512vl(auVar53,auVar53);
  auVar53 = vfmadd213ps_avx512vl(auVar53,auVar43,auVar60);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar42,auVar71._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar61,auVar71._0_16_);
  auVar60 = vmulps_avx512vl(auVar60,auVar64);
  auVar43 = vfnmadd231ps_avx512vl(auVar60,auVar64,auVar43);
  auVar42 = vfmadd231ps_avx512vl(auVar43,auVar71._0_16_,auVar42);
  auVar61 = vfnmadd231ps_avx512vl(auVar42,auVar71._0_16_,auVar61);
  auVar42 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar54,auVar63);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar56,auVar71._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar62,auVar71._0_16_);
  auVar42 = vmulps_avx512vl(auVar63,auVar64);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar64,auVar54);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar71._0_16_,auVar56);
  auVar60 = vfnmadd231ps_avx512vl(auVar42,auVar71._0_16_,auVar62);
  auVar42 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar56 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  fVar198 = auVar55._0_4_;
  auVar225._0_4_ = fVar198 * auVar56._0_4_;
  fVar209 = auVar55._4_4_;
  auVar225._4_4_ = fVar209 * auVar56._4_4_;
  fVar210 = auVar55._8_4_;
  auVar225._8_4_ = fVar210 * auVar56._8_4_;
  fVar211 = auVar55._12_4_;
  auVar225._12_4_ = fVar211 * auVar56._12_4_;
  auVar56 = vfmsub231ps_avx512vl(auVar225,auVar42,auVar59);
  auVar56 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar62 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  auVar232._0_4_ = fVar198 * auVar62._0_4_;
  auVar232._4_4_ = fVar209 * auVar62._4_4_;
  auVar232._8_4_ = fVar210 * auVar62._8_4_;
  auVar232._12_4_ = fVar211 * auVar62._12_4_;
  auVar42 = vfmsub231ps_avx512vl(auVar232,auVar42,auVar57);
  auVar57 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar62 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar62 = vmulps_avx512vl(auVar61,auVar62);
  auVar43 = vfmsub231ps_avx512vl(auVar62,auVar42,auVar43);
  auVar62 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx512vl(auVar60,auVar60,0xc9);
  auVar43 = vmulps_avx512vl(auVar61,auVar43);
  auVar42 = vfmsub231ps_avx512vl(auVar43,auVar42,auVar60);
  auVar60 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar56,auVar56,0x7f);
  auVar75._16_16_ = auVar86._16_16_;
  auVar75._0_16_ = auVar71._0_16_;
  auVar74._4_28_ = auVar75._4_28_;
  auVar74._0_4_ = auVar42._0_4_;
  auVar43 = vrsqrt14ss_avx512f(auVar71._0_16_,auVar74._0_16_);
  auVar63 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  auVar54 = vmulss_avx512f(auVar54,auVar43);
  auVar43 = vmulss_avx512f(auVar43,auVar43);
  auVar43 = vmulss_avx512f(auVar54,auVar43);
  auVar43 = vsubss_avx512f(auVar63,auVar43);
  auVar63 = vbroadcastss_avx512vl(auVar43);
  auVar54 = vmulps_avx512vl(auVar56,auVar63);
  auVar43 = vdpps_avx(auVar56,auVar57,0x7f);
  auVar59 = vbroadcastss_avx512vl(auVar42);
  auVar57 = vmulps_avx512vl(auVar59,auVar57);
  fVar214 = auVar43._0_4_;
  auVar59._0_4_ = auVar56._0_4_ * fVar214;
  auVar59._4_4_ = auVar56._4_4_ * fVar214;
  auVar59._8_4_ = auVar56._8_4_ * fVar214;
  auVar59._12_4_ = auVar56._12_4_ * fVar214;
  auVar43 = vsubps_avx(auVar57,auVar59);
  auVar56 = vrcp14ss_avx512f(auVar71._0_16_,auVar74._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar56,ZEXT416(0x40000000));
  fVar214 = auVar56._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar62,auVar62,0x7f);
  auVar64._0_4_ = fVar214 * auVar43._0_4_;
  auVar64._4_4_ = fVar214 * auVar43._4_4_;
  auVar64._8_4_ = fVar214 * auVar43._8_4_;
  auVar64._12_4_ = fVar214 * auVar43._12_4_;
  auVar56 = vmulps_avx512vl(auVar63,auVar64);
  auVar77._16_16_ = auVar86._16_16_;
  auVar77._0_16_ = auVar71._0_16_;
  auVar76._4_28_ = auVar77._4_28_;
  auVar76._0_4_ = auVar42._0_4_;
  auVar43 = vrsqrt14ss_avx512f(auVar71._0_16_,auVar76._0_16_);
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar59 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar63 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar250 = ZEXT1664(auVar64);
  auVar63 = vmulss_avx512f(auVar63,auVar43);
  auVar43 = vmulss_avx512f(auVar63,ZEXT416((uint)(auVar43._0_4_ * auVar43._0_4_)));
  auVar43 = vsubss_avx512f(auVar57,auVar43);
  auVar233._0_4_ = auVar43._0_4_;
  auVar233._4_4_ = auVar233._0_4_;
  auVar233._8_4_ = auVar233._0_4_;
  auVar233._12_4_ = auVar233._0_4_;
  auVar57 = vmulps_avx512vl(auVar62,auVar233);
  auVar43 = vdpps_avx(auVar62,auVar60,0x7f);
  auVar63 = vbroadcastss_avx512vl(auVar42);
  auVar60 = vmulps_avx512vl(auVar63,auVar60);
  fVar214 = auVar43._0_4_;
  auVar136._0_4_ = auVar62._0_4_ * fVar214;
  auVar136._4_4_ = auVar62._4_4_ * fVar214;
  auVar136._8_4_ = auVar62._8_4_ * fVar214;
  auVar136._12_4_ = auVar62._12_4_ * fVar214;
  auVar43 = vsubps_avx(auVar60,auVar136);
  auVar60 = vrcp14ss_avx512f(auVar71._0_16_,auVar76._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar60,ZEXT416(0x40000000));
  auVar248 = ZEXT464(0x3f800000);
  fVar214 = auVar60._0_4_ * auVar42._0_4_;
  auVar60 = vshufps_avx512vl(auVar58,auVar58,0xff);
  auVar62 = vmulps_avx512vl(auVar60,auVar54);
  auVar63 = vsubps_avx512vl(auVar58,auVar62);
  auVar42 = vshufps_avx(auVar55,auVar55,0xff);
  auVar42 = vmulps_avx512vl(auVar42,auVar54);
  auVar54._0_4_ = auVar42._0_4_ + auVar60._0_4_ * auVar56._0_4_;
  auVar54._4_4_ = auVar42._4_4_ + auVar60._4_4_ * auVar56._4_4_;
  auVar54._8_4_ = auVar42._8_4_ + auVar60._8_4_ * auVar56._8_4_;
  auVar54._12_4_ = auVar42._12_4_ + auVar60._12_4_ * auVar56._12_4_;
  auVar42 = vsubps_avx(auVar55,auVar54);
  auVar56 = vaddps_avx512vl(auVar58,auVar62);
  auVar55._0_4_ = fVar198 + auVar54._0_4_;
  auVar55._4_4_ = fVar209 + auVar54._4_4_;
  auVar55._8_4_ = fVar210 + auVar54._8_4_;
  auVar55._12_4_ = fVar211 + auVar54._12_4_;
  auVar60 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar62 = vmulps_avx512vl(auVar60,auVar57);
  auVar86._16_16_ = vsubps_avx512vl(auVar53,auVar62);
  auVar54 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar57 = vmulps_avx512vl(auVar54,auVar57);
  auVar137._0_4_ = auVar60._0_4_ * auVar233._0_4_ * fVar214 * auVar43._0_4_;
  auVar137._4_4_ = auVar60._4_4_ * auVar233._0_4_ * fVar214 * auVar43._4_4_;
  auVar137._8_4_ = auVar60._8_4_ * auVar233._0_4_ * fVar214 * auVar43._8_4_;
  auVar137._12_4_ = auVar60._12_4_ * auVar233._0_4_ * fVar214 * auVar43._12_4_;
  auVar57 = vaddps_avx512vl(auVar57,auVar137);
  auVar43 = vsubps_avx(auVar61,auVar57);
  auVar60 = vaddps_avx512vl(auVar53,auVar62);
  auVar138._0_4_ = auVar61._0_4_ + auVar57._0_4_;
  auVar138._4_4_ = auVar61._4_4_ + auVar57._4_4_;
  auVar138._8_4_ = auVar61._8_4_ + auVar57._8_4_;
  auVar138._12_4_ = auVar61._12_4_ + auVar57._12_4_;
  auVar42 = vmulps_avx512vl(auVar42,auVar46);
  auVar190._0_4_ = auVar63._0_4_ + auVar42._0_4_;
  auVar190._4_4_ = auVar63._4_4_ + auVar42._4_4_;
  auVar190._8_4_ = auVar63._8_4_ + auVar42._8_4_;
  auVar190._12_4_ = auVar63._12_4_ + auVar42._12_4_;
  auVar42 = vmulps_avx512vl(auVar43,auVar46);
  auVar42 = vsubps_avx(auVar86._16_16_,auVar42);
  auVar43 = vmulps_avx512vl(auVar55,auVar46);
  auVar53._0_4_ = auVar56._0_4_ + auVar43._0_4_;
  auVar53._4_4_ = auVar56._4_4_ + auVar43._4_4_;
  auVar53._8_4_ = auVar56._8_4_ + auVar43._8_4_;
  auVar53._12_4_ = auVar56._12_4_ + auVar43._12_4_;
  auVar43 = vmulps_avx512vl(auVar138,auVar46);
  auVar43 = vsubps_avx(auVar60,auVar43);
  auVar57 = vbroadcastss_avx512vl(auVar45);
  auVar61 = vsubss_avx512f(ZEXT416(0x3f800000),auVar45);
  auVar61 = vbroadcastss_avx512vl(auVar61);
  fVar214 = auVar57._0_4_;
  auVar221._0_4_ = fVar214 * auVar63._0_4_;
  fVar198 = auVar57._4_4_;
  auVar221._4_4_ = fVar198 * auVar63._4_4_;
  fVar209 = auVar57._8_4_;
  auVar221._8_4_ = fVar209 * auVar63._8_4_;
  fVar210 = auVar57._12_4_;
  auVar221._12_4_ = fVar210 * auVar63._12_4_;
  auVar62 = vmulps_avx512vl(auVar57,auVar190);
  auVar42 = vmulps_avx512vl(auVar57,auVar42);
  auVar234._0_4_ = fVar214 * auVar86._16_4_;
  auVar234._4_4_ = fVar198 * auVar86._20_4_;
  auVar234._8_4_ = fVar209 * auVar86._24_4_;
  auVar234._12_4_ = fVar210 * auVar86._28_4_;
  local_1b8 = vfmadd231ps_avx512vl(auVar221,auVar61,auVar49);
  local_1c8 = vfmadd231ps_avx512vl(auVar62,auVar61,auVar158);
  local_1d8 = vfmadd231ps_avx512vl(auVar42,auVar61,auVar44);
  local_1e8 = vfmadd231ps_avx512vl(auVar234,auVar61,auVar50);
  auVar42 = vmulps_avx512vl(auVar57,auVar56);
  auVar56 = vmulps_avx512vl(auVar57,auVar53);
  auVar43 = vmulps_avx512vl(auVar57,auVar43);
  auVar226._0_4_ = fVar214 * auVar60._0_4_;
  auVar226._4_4_ = fVar198 * auVar60._4_4_;
  auVar226._8_4_ = fVar209 * auVar60._8_4_;
  auVar226._12_4_ = fVar210 * auVar60._12_4_;
  _local_1f8 = vfmadd231ps_avx512vl(auVar42,auVar61,auVar48);
  _local_208 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar52);
  _local_218 = vfmadd231ps_avx512vl(auVar43,auVar61,auVar47);
  _local_228 = vfmadd231ps_avx512vl(auVar226,auVar61,auVar51);
  aVar2 = (ray->org).field_0;
  auVar43 = vsubps_avx(local_1b8,(undefined1  [16])aVar2);
  uVar106 = auVar43._0_4_;
  auVar46._4_4_ = uVar106;
  auVar46._0_4_ = uVar106;
  auVar46._8_4_ = uVar106;
  auVar46._12_4_ = uVar106;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  aVar3 = (pre->ray_space).vx.field_0;
  aVar4 = (pre->ray_space).vy.field_0;
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar214 = (pre->ray_space).vz.field_0.m128[0];
  fVar198 = (pre->ray_space).vz.field_0.m128[1];
  fVar209 = (pre->ray_space).vz.field_0.m128[2];
  fVar210 = (pre->ray_space).vz.field_0.m128[3];
  auVar45._0_4_ = fVar214 * auVar43._0_4_;
  auVar45._4_4_ = fVar198 * auVar43._4_4_;
  auVar45._8_4_ = fVar209 * auVar43._8_4_;
  auVar45._12_4_ = fVar210 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar4,auVar42);
  auVar61 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar46);
  auVar43 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar2);
  uVar106 = auVar43._0_4_;
  auVar50._4_4_ = uVar106;
  auVar50._0_4_ = uVar106;
  auVar50._8_4_ = uVar106;
  auVar50._12_4_ = uVar106;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar48._0_4_ = fVar214 * auVar43._0_4_;
  auVar48._4_4_ = fVar198 * auVar43._4_4_;
  auVar48._8_4_ = fVar209 * auVar43._8_4_;
  auVar48._12_4_ = fVar210 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar4,auVar42);
  auVar60 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar50);
  auVar43 = vsubps_avx512vl(local_1d8,(undefined1  [16])aVar2);
  uVar106 = auVar43._0_4_;
  auVar150._4_4_ = uVar106;
  auVar150._0_4_ = uVar106;
  auVar150._8_4_ = uVar106;
  auVar150._12_4_ = uVar106;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar51._0_4_ = fVar214 * auVar43._0_4_;
  auVar51._4_4_ = fVar198 * auVar43._4_4_;
  auVar51._8_4_ = fVar209 * auVar43._8_4_;
  auVar51._12_4_ = fVar210 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar42);
  auVar62 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar150);
  auVar43 = vsubps_avx(local_1e8,(undefined1  [16])aVar2);
  uVar106 = auVar43._0_4_;
  auVar170._4_4_ = uVar106;
  auVar170._0_4_ = uVar106;
  auVar170._8_4_ = uVar106;
  auVar170._12_4_ = uVar106;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar151._0_4_ = fVar214 * auVar43._0_4_;
  auVar151._4_4_ = fVar198 * auVar43._4_4_;
  auVar151._8_4_ = fVar209 * auVar43._8_4_;
  auVar151._12_4_ = fVar210 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar4,auVar42);
  auVar63 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar170);
  auVar43 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar2);
  uVar106 = auVar43._0_4_;
  auVar179._4_4_ = uVar106;
  auVar179._0_4_ = uVar106;
  auVar179._8_4_ = uVar106;
  auVar179._12_4_ = uVar106;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar171._0_4_ = auVar43._0_4_ * fVar214;
  auVar171._4_4_ = auVar43._4_4_ * fVar198;
  auVar171._8_4_ = auVar43._8_4_ * fVar209;
  auVar171._12_4_ = auVar43._12_4_ * fVar210;
  auVar42 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar4,auVar42);
  auVar44 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar179);
  auVar43 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar2);
  uVar106 = auVar43._0_4_;
  auVar191._4_4_ = uVar106;
  auVar191._0_4_ = uVar106;
  auVar191._8_4_ = uVar106;
  auVar191._12_4_ = uVar106;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar180._0_4_ = auVar43._0_4_ * fVar214;
  auVar180._4_4_ = auVar43._4_4_ * fVar198;
  auVar180._8_4_ = auVar43._8_4_ * fVar209;
  auVar180._12_4_ = auVar43._12_4_ * fVar210;
  auVar42 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar4,auVar42);
  auVar86._16_16_ = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar191);
  auVar43 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar2);
  uVar106 = auVar43._0_4_;
  auVar199._4_4_ = uVar106;
  auVar199._0_4_ = uVar106;
  auVar199._8_4_ = uVar106;
  auVar199._12_4_ = uVar106;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar192._0_4_ = auVar43._0_4_ * fVar214;
  auVar192._4_4_ = auVar43._4_4_ * fVar198;
  auVar192._8_4_ = auVar43._8_4_ * fVar209;
  auVar192._12_4_ = auVar43._12_4_ * fVar210;
  auVar42 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar4,auVar42);
  auVar47 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar199);
  auVar43 = vsubps_avx(_local_228,(undefined1  [16])aVar2);
  uVar106 = auVar43._0_4_;
  auVar200._4_4_ = uVar106;
  auVar200._0_4_ = uVar106;
  auVar200._8_4_ = uVar106;
  auVar200._12_4_ = uVar106;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar52._0_4_ = fVar214 * auVar43._0_4_;
  auVar52._4_4_ = fVar198 * auVar43._4_4_;
  auVar52._8_4_ = fVar209 * auVar43._8_4_;
  auVar52._12_4_ = fVar210 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar42);
  auVar45 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar3,auVar200);
  local_338 = vmovlhps_avx512f(auVar61,auVar44);
  auVar249 = ZEXT1664(local_338);
  local_298 = vmovlhps_avx(auVar60,auVar86._16_16_);
  local_288 = vmovlhps_avx512f(auVar62,auVar47);
  _local_198 = vmovlhps_avx512f(auVar63,auVar45);
  auVar42 = vminps_avx512vl(local_338,local_298);
  auVar56 = vmaxps_avx512vl(local_338,local_298);
  auVar43 = vminps_avx512vl(local_288,_local_198);
  auVar43 = vminps_avx(auVar42,auVar43);
  auVar42 = vmaxps_avx512vl(local_288,_local_198);
  auVar42 = vmaxps_avx(auVar56,auVar42);
  auVar56 = vshufpd_avx(auVar43,auVar43,3);
  auVar57 = vshufpd_avx(auVar42,auVar42,3);
  auVar43 = vminps_avx(auVar43,auVar56);
  auVar42 = vmaxps_avx(auVar42,auVar57);
  auVar43 = vandps_avx512vl(auVar43,auVar64);
  auVar42 = vandps_avx512vl(auVar42,auVar64);
  auVar42 = vmaxps_avx(auVar43,auVar42);
  auVar43 = vmovshdup_avx(auVar42);
  auVar42 = vmaxss_avx(auVar43,auVar42);
  lVar35 = uVar36 + 0xff;
  local_2a8._8_8_ = auVar61._0_8_;
  local_2a8._0_8_ = auVar61._0_8_;
  local_2b8._8_8_ = auVar60._0_8_;
  local_2b8._0_8_ = auVar60._0_8_;
  local_2c8 = vmovddup_avx512vl(auVar62);
  local_2d8 = vmovddup_avx512vl(auVar63);
  register0x00001348 = auVar44._0_8_;
  local_2e8 = auVar44._0_8_;
  register0x00001388 = auVar86._16_8_;
  local_2f8 = auVar86._16_8_;
  register0x00001408 = auVar47._0_8_;
  local_308 = auVar47._0_8_;
  register0x00001448 = auVar45._0_8_;
  local_318 = auVar45._0_8_;
  local_1a8 = ZEXT416((uint)(auVar42._0_4_ * 9.536743e-07));
  local_d8 = vbroadcastss_avx512vl(local_1a8);
  auVar42 = vxorps_avx512vl(local_d8._0_16_,auVar59);
  local_78 = auVar42._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  local_e8 = vsubps_avx512vl(local_298,local_338);
  local_f8 = vsubps_avx512vl(local_288,local_298);
  local_108 = vsubps_avx512vl(_local_198,local_288);
  local_118 = vsubps_avx512vl(_local_1f8,local_1b8);
  local_128 = vsubps_avx512vl(_local_208,local_1c8);
  local_138 = vsubps_avx512vl(_local_218,local_1d8);
  _local_148 = vsubps_avx(_local_228,local_1e8);
  bVar34 = false;
  auVar42 = ZEXT816(0x3f80000000000000);
  uVar28 = 0;
  auVar47 = auVar42;
LAB_01e54af3:
  do {
    auVar43 = vshufps_avx(auVar47,auVar47,0x50);
    auVar227._8_4_ = 0x3f800000;
    auVar227._0_8_ = 0x3f8000003f800000;
    auVar227._12_4_ = 0x3f800000;
    auVar231._16_4_ = 0x3f800000;
    auVar231._0_16_ = auVar227;
    auVar231._20_4_ = 0x3f800000;
    auVar231._24_4_ = 0x3f800000;
    auVar231._28_4_ = 0x3f800000;
    auVar56 = vsubps_avx(auVar227,auVar43);
    fVar214 = auVar43._0_4_;
    auVar128._0_4_ = local_2e8._0_4_ * fVar214;
    fVar198 = auVar43._4_4_;
    auVar128._4_4_ = local_2e8._4_4_ * fVar198;
    fVar209 = auVar43._8_4_;
    auVar128._8_4_ = local_2e8._8_4_ * fVar209;
    fVar210 = auVar43._12_4_;
    auVar128._12_4_ = local_2e8._12_4_ * fVar210;
    auVar139._0_4_ = local_2f8._0_4_ * fVar214;
    auVar139._4_4_ = local_2f8._4_4_ * fVar198;
    auVar139._8_4_ = local_2f8._8_4_ * fVar209;
    auVar139._12_4_ = local_2f8._12_4_ * fVar210;
    auVar152._0_4_ = local_308._0_4_ * fVar214;
    auVar152._4_4_ = local_308._4_4_ * fVar198;
    auVar152._8_4_ = local_308._8_4_ * fVar209;
    auVar152._12_4_ = local_308._12_4_ * fVar210;
    auVar114._0_4_ = local_318._0_4_ * fVar214;
    auVar114._4_4_ = local_318._4_4_ * fVar198;
    auVar114._8_4_ = local_318._8_4_ * fVar209;
    auVar114._12_4_ = local_318._12_4_ * fVar210;
    auVar57 = vfmadd231ps_fma(auVar128,auVar56,local_2a8);
    auVar61 = vfmadd231ps_fma(auVar139,auVar56,local_2b8);
    auVar60 = vfmadd231ps_avx512vl(auVar152,auVar56,local_2c8);
    auVar56 = vfmadd231ps_avx512vl(auVar114,local_2d8,auVar56);
    auVar43 = vmovshdup_avx(auVar42);
    fVar198 = auVar42._0_4_;
    fVar214 = (auVar43._0_4_ - fVar198) * 0.04761905;
    auVar177._4_4_ = fVar198;
    auVar177._0_4_ = fVar198;
    auVar177._8_4_ = fVar198;
    auVar177._12_4_ = fVar198;
    auVar177._16_4_ = fVar198;
    auVar177._20_4_ = fVar198;
    auVar177._24_4_ = fVar198;
    auVar177._28_4_ = fVar198;
    auVar126._0_8_ = auVar43._0_8_;
    auVar126._8_8_ = auVar126._0_8_;
    auVar126._16_8_ = auVar126._0_8_;
    auVar126._24_8_ = auVar126._0_8_;
    auVar69 = vsubps_avx(auVar126,auVar177);
    uVar106 = auVar57._0_4_;
    auVar127._4_4_ = uVar106;
    auVar127._0_4_ = uVar106;
    auVar127._8_4_ = uVar106;
    auVar127._12_4_ = uVar106;
    auVar127._16_4_ = uVar106;
    auVar127._20_4_ = uVar106;
    auVar127._24_4_ = uVar106;
    auVar127._28_4_ = uVar106;
    auVar195._8_4_ = 1;
    auVar195._0_8_ = 0x100000001;
    auVar195._12_4_ = 1;
    auVar195._16_4_ = 1;
    auVar195._20_4_ = 1;
    auVar195._24_4_ = 1;
    auVar195._28_4_ = 1;
    auVar89 = ZEXT1632(auVar57);
    auVar68 = vpermps_avx2(auVar195,auVar89);
    auVar78 = vbroadcastss_avx512vl(auVar61);
    auVar90 = ZEXT1632(auVar61);
    auVar79 = vpermps_avx512vl(auVar195,auVar90);
    auVar80 = vbroadcastss_avx512vl(auVar60);
    auVar87 = ZEXT1632(auVar60);
    auVar81 = vpermps_avx512vl(auVar195,auVar87);
    auVar82 = vbroadcastss_avx512vl(auVar56);
    auVar86 = ZEXT1632(auVar56);
    auVar83 = vpermps_avx512vl(auVar195,auVar86);
    auVar196._4_4_ = fVar214;
    auVar196._0_4_ = fVar214;
    auVar196._8_4_ = fVar214;
    auVar196._12_4_ = fVar214;
    auVar196._16_4_ = fVar214;
    auVar196._20_4_ = fVar214;
    auVar196._24_4_ = fVar214;
    auVar196._28_4_ = fVar214;
    auVar84 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar67 = vpermps_avx512vl(auVar84,auVar89);
    auVar166._8_4_ = 3;
    auVar166._0_8_ = 0x300000003;
    auVar166._12_4_ = 3;
    auVar166._16_4_ = 3;
    auVar166._20_4_ = 3;
    auVar166._24_4_ = 3;
    auVar166._28_4_ = 3;
    auVar65 = vpermps_avx512vl(auVar166,auVar89);
    auVar66 = vpermps_avx512vl(auVar84,auVar90);
    auVar89 = vpermps_avx2(auVar166,auVar90);
    auVar85 = vpermps_avx512vl(auVar84,auVar87);
    auVar90 = vpermps_avx2(auVar166,auVar87);
    auVar84 = vpermps_avx512vl(auVar84,auVar86);
    auVar86 = vpermps_avx512vl(auVar166,auVar86);
    auVar43 = vfmadd132ps_fma(auVar69,auVar177,_DAT_01faff20);
    auVar69 = vsubps_avx(auVar231,ZEXT1632(auVar43));
    auVar87 = vmulps_avx512vl(auVar78,ZEXT1632(auVar43));
    auVar91 = ZEXT1632(auVar43);
    auVar88 = vmulps_avx512vl(auVar79,auVar91);
    auVar56 = vfmadd231ps_fma(auVar87,auVar69,auVar127);
    auVar57 = vfmadd231ps_fma(auVar88,auVar69,auVar68);
    auVar87 = vmulps_avx512vl(auVar80,auVar91);
    auVar88 = vmulps_avx512vl(auVar81,auVar91);
    auVar78 = vfmadd231ps_avx512vl(auVar87,auVar69,auVar78);
    auVar79 = vfmadd231ps_avx512vl(auVar88,auVar69,auVar79);
    auVar87 = vmulps_avx512vl(auVar82,auVar91);
    auVar88 = ZEXT1632(auVar43);
    auVar83 = vmulps_avx512vl(auVar83,auVar88);
    auVar80 = vfmadd231ps_avx512vl(auVar87,auVar69,auVar80);
    auVar81 = vfmadd231ps_avx512vl(auVar83,auVar69,auVar81);
    fVar209 = auVar43._0_4_;
    fVar210 = auVar43._4_4_;
    auVar19._4_4_ = fVar210 * auVar78._4_4_;
    auVar19._0_4_ = fVar209 * auVar78._0_4_;
    fVar211 = auVar43._8_4_;
    auVar19._8_4_ = fVar211 * auVar78._8_4_;
    fVar212 = auVar43._12_4_;
    auVar19._12_4_ = fVar212 * auVar78._12_4_;
    auVar19._16_4_ = auVar78._16_4_ * 0.0;
    auVar19._20_4_ = auVar78._20_4_ * 0.0;
    auVar19._24_4_ = auVar78._24_4_ * 0.0;
    auVar19._28_4_ = fVar198;
    auVar20._4_4_ = fVar210 * auVar79._4_4_;
    auVar20._0_4_ = fVar209 * auVar79._0_4_;
    auVar20._8_4_ = fVar211 * auVar79._8_4_;
    auVar20._12_4_ = fVar212 * auVar79._12_4_;
    auVar20._16_4_ = auVar79._16_4_ * 0.0;
    auVar20._20_4_ = auVar79._20_4_ * 0.0;
    auVar20._24_4_ = auVar79._24_4_ * 0.0;
    auVar20._28_4_ = auVar68._28_4_;
    auVar56 = vfmadd231ps_fma(auVar19,auVar69,ZEXT1632(auVar56));
    auVar57 = vfmadd231ps_fma(auVar20,auVar69,ZEXT1632(auVar57));
    auVar119._0_4_ = fVar209 * auVar80._0_4_;
    auVar119._4_4_ = fVar210 * auVar80._4_4_;
    auVar119._8_4_ = fVar211 * auVar80._8_4_;
    auVar119._12_4_ = fVar212 * auVar80._12_4_;
    auVar119._16_4_ = auVar80._16_4_ * 0.0;
    auVar119._20_4_ = auVar80._20_4_ * 0.0;
    auVar119._24_4_ = auVar80._24_4_ * 0.0;
    auVar119._28_4_ = 0;
    auVar21._4_4_ = fVar210 * auVar81._4_4_;
    auVar21._0_4_ = fVar209 * auVar81._0_4_;
    auVar21._8_4_ = fVar211 * auVar81._8_4_;
    auVar21._12_4_ = fVar212 * auVar81._12_4_;
    auVar21._16_4_ = auVar81._16_4_ * 0.0;
    auVar21._20_4_ = auVar81._20_4_ * 0.0;
    auVar21._24_4_ = auVar81._24_4_ * 0.0;
    auVar21._28_4_ = auVar80._28_4_;
    auVar61 = vfmadd231ps_fma(auVar119,auVar69,auVar78);
    auVar60 = vfmadd231ps_fma(auVar21,auVar69,auVar79);
    auVar22._28_4_ = auVar79._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar212 * auVar60._12_4_,
                            CONCAT48(fVar211 * auVar60._8_4_,
                                     CONCAT44(fVar210 * auVar60._4_4_,fVar209 * auVar60._0_4_))));
    auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar212 * auVar61._12_4_,
                                                 CONCAT48(fVar211 * auVar61._8_4_,
                                                          CONCAT44(fVar210 * auVar61._4_4_,
                                                                   fVar209 * auVar61._0_4_)))),
                              auVar69,ZEXT1632(auVar56));
    auVar63 = vfmadd231ps_fma(auVar22,auVar69,ZEXT1632(auVar57));
    auVar68 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar56));
    auVar78 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar57));
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar68 = vmulps_avx512vl(auVar68,auVar79);
    auVar78 = vmulps_avx512vl(auVar78,auVar79);
    auVar189._0_4_ = fVar214 * auVar68._0_4_;
    auVar189._4_4_ = fVar214 * auVar68._4_4_;
    auVar189._8_4_ = fVar214 * auVar68._8_4_;
    auVar189._12_4_ = fVar214 * auVar68._12_4_;
    auVar189._16_4_ = fVar214 * auVar68._16_4_;
    auVar189._20_4_ = fVar214 * auVar68._20_4_;
    auVar189._24_4_ = fVar214 * auVar68._24_4_;
    auVar189._28_4_ = 0;
    auVar68 = vmulps_avx512vl(auVar196,auVar78);
    auVar57 = vxorps_avx512vl(auVar82._0_16_,auVar82._0_16_);
    auVar78 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_01feed00,ZEXT1632(auVar57));
    auVar80 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01feed00,ZEXT1632(auVar57));
    auVar120._0_4_ = auVar189._0_4_ + auVar62._0_4_;
    auVar120._4_4_ = auVar189._4_4_ + auVar62._4_4_;
    auVar120._8_4_ = auVar189._8_4_ + auVar62._8_4_;
    auVar120._12_4_ = auVar189._12_4_ + auVar62._12_4_;
    auVar120._16_4_ = auVar189._16_4_ + 0.0;
    auVar120._20_4_ = auVar189._20_4_ + 0.0;
    auVar120._24_4_ = auVar189._24_4_ + 0.0;
    auVar120._28_4_ = 0;
    auVar91 = ZEXT1632(auVar57);
    auVar81 = vpermt2ps_avx512vl(auVar189,_DAT_01feed00,auVar91);
    auVar82 = vaddps_avx512vl(ZEXT1632(auVar63),auVar68);
    auVar83 = vpermt2ps_avx512vl(auVar68,_DAT_01feed00,auVar91);
    auVar68 = vsubps_avx(auVar78,auVar81);
    auVar81 = vsubps_avx512vl(auVar80,auVar83);
    auVar83 = vmulps_avx512vl(auVar66,auVar88);
    auVar87 = vmulps_avx512vl(auVar89,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar69,auVar67);
    auVar67 = vfmadd231ps_avx512vl(auVar87,auVar69,auVar65);
    auVar65 = vmulps_avx512vl(auVar85,auVar88);
    auVar87 = vmulps_avx512vl(auVar90,auVar88);
    auVar65 = vfmadd231ps_avx512vl(auVar65,auVar69,auVar66);
    auVar89 = vfmadd231ps_avx512vl(auVar87,auVar69,auVar89);
    auVar84 = vmulps_avx512vl(auVar84,auVar88);
    auVar66 = vmulps_avx512vl(auVar86,auVar88);
    auVar56 = vfmadd231ps_fma(auVar84,auVar69,auVar85);
    auVar84 = vfmadd231ps_avx512vl(auVar66,auVar69,auVar90);
    auVar66 = vmulps_avx512vl(auVar88,auVar65);
    auVar86 = ZEXT1632(auVar43);
    auVar85 = vmulps_avx512vl(auVar86,auVar89);
    auVar83 = vfmadd231ps_avx512vl(auVar66,auVar69,auVar83);
    auVar67 = vfmadd231ps_avx512vl(auVar85,auVar69,auVar67);
    auVar84 = vmulps_avx512vl(auVar86,auVar84);
    auVar65 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar212 * auVar56._12_4_,
                                            CONCAT48(fVar211 * auVar56._8_4_,
                                                     CONCAT44(fVar210 * auVar56._4_4_,
                                                              fVar209 * auVar56._0_4_)))),auVar69,
                         auVar65);
    auVar89 = vfmadd231ps_avx512vl(auVar84,auVar69,auVar89);
    auVar23._4_4_ = fVar210 * auVar65._4_4_;
    auVar23._0_4_ = fVar209 * auVar65._0_4_;
    auVar23._8_4_ = fVar211 * auVar65._8_4_;
    auVar23._12_4_ = fVar212 * auVar65._12_4_;
    auVar23._16_4_ = auVar65._16_4_ * 0.0;
    auVar23._20_4_ = auVar65._20_4_ * 0.0;
    auVar23._24_4_ = auVar65._24_4_ * 0.0;
    auVar23._28_4_ = auVar90._28_4_;
    auVar90 = vmulps_avx512vl(auVar86,auVar89);
    auVar84 = vfmadd231ps_avx512vl(auVar23,auVar69,auVar83);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar67,auVar69);
    auVar69 = vsubps_avx512vl(auVar65,auVar83);
    auVar89 = vsubps_avx512vl(auVar89,auVar67);
    auVar69 = vmulps_avx512vl(auVar69,auVar79);
    auVar89 = vmulps_avx512vl(auVar89,auVar79);
    fVar198 = fVar214 * auVar69._0_4_;
    fVar209 = fVar214 * auVar69._4_4_;
    auVar24._4_4_ = fVar209;
    auVar24._0_4_ = fVar198;
    fVar210 = fVar214 * auVar69._8_4_;
    auVar24._8_4_ = fVar210;
    fVar211 = fVar214 * auVar69._12_4_;
    auVar24._12_4_ = fVar211;
    fVar212 = fVar214 * auVar69._16_4_;
    auVar24._16_4_ = fVar212;
    fVar213 = fVar214 * auVar69._20_4_;
    auVar24._20_4_ = fVar213;
    fVar214 = fVar214 * auVar69._24_4_;
    auVar24._24_4_ = fVar214;
    auVar24._28_4_ = auVar69._28_4_;
    auVar89 = vmulps_avx512vl(auVar196,auVar89);
    auVar79 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,auVar91);
    auVar83 = vpermt2ps_avx512vl(auVar90,_DAT_01feed00,auVar91);
    auVar197._0_4_ = auVar84._0_4_ + fVar198;
    auVar197._4_4_ = auVar84._4_4_ + fVar209;
    auVar197._8_4_ = auVar84._8_4_ + fVar210;
    auVar197._12_4_ = auVar84._12_4_ + fVar211;
    auVar197._16_4_ = auVar84._16_4_ + fVar212;
    auVar197._20_4_ = auVar84._20_4_ + fVar213;
    auVar197._24_4_ = auVar84._24_4_ + fVar214;
    auVar197._28_4_ = auVar84._28_4_ + auVar69._28_4_;
    auVar69 = vpermt2ps_avx512vl(auVar24,_DAT_01feed00,ZEXT1632(auVar57));
    auVar67 = vaddps_avx512vl(auVar90,auVar89);
    auVar241 = ZEXT3264(auVar67);
    auVar89 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,ZEXT1632(auVar57));
    auVar69 = vsubps_avx(auVar79,auVar69);
    auVar89 = vsubps_avx512vl(auVar83,auVar89);
    in_ZMM17 = ZEXT3264(auVar89);
    auVar131 = ZEXT1632(auVar62);
    auVar65 = vsubps_avx512vl(auVar84,auVar131);
    auVar145 = ZEXT1632(auVar63);
    auVar66 = vsubps_avx512vl(auVar90,auVar145);
    auVar85 = vsubps_avx512vl(auVar79,auVar78);
    auVar65 = vaddps_avx512vl(auVar65,auVar85);
    auVar85 = vsubps_avx512vl(auVar83,auVar80);
    auVar66 = vaddps_avx512vl(auVar66,auVar85);
    auVar85 = vmulps_avx512vl(auVar145,auVar65);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar131,auVar66);
    auVar86 = vmulps_avx512vl(auVar82,auVar65);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar120,auVar66);
    auVar87 = vmulps_avx512vl(auVar81,auVar65);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar68,auVar66);
    auVar88 = vmulps_avx512vl(auVar80,auVar65);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar78,auVar66);
    auVar91 = vmulps_avx512vl(auVar90,auVar65);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar84,auVar66);
    auVar92 = vmulps_avx512vl(auVar67,auVar65);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar197,auVar66);
    auVar93 = vmulps_avx512vl(auVar89,auVar65);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar69,auVar66);
    auVar65 = vmulps_avx512vl(auVar83,auVar65);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar79,auVar66);
    auVar66 = vminps_avx512vl(auVar85,auVar86);
    auVar85 = vmaxps_avx512vl(auVar85,auVar86);
    auVar86 = vminps_avx512vl(auVar87,auVar88);
    auVar66 = vminps_avx512vl(auVar66,auVar86);
    auVar86 = vmaxps_avx512vl(auVar87,auVar88);
    auVar85 = vmaxps_avx512vl(auVar85,auVar86);
    auVar86 = vminps_avx512vl(auVar91,auVar92);
    auVar87 = vmaxps_avx512vl(auVar91,auVar92);
    auVar88 = vminps_avx512vl(auVar93,auVar65);
    auVar86 = vminps_avx512vl(auVar86,auVar88);
    auVar66 = vminps_avx512vl(auVar66,auVar86);
    auVar65 = vmaxps_avx512vl(auVar93,auVar65);
    auVar65 = vmaxps_avx512vl(auVar87,auVar65);
    auVar65 = vmaxps_avx512vl(auVar85,auVar65);
    uVar13 = vcmpps_avx512vl(auVar66,local_d8,2);
    auVar25._4_4_ = uStack_74;
    auVar25._0_4_ = local_78;
    auVar25._8_4_ = uStack_70;
    auVar25._12_4_ = uStack_6c;
    auVar25._16_4_ = uStack_68;
    auVar25._20_4_ = uStack_64;
    auVar25._24_4_ = uStack_60;
    auVar25._28_4_ = uStack_5c;
    uVar14 = vcmpps_avx512vl(auVar65,auVar25,5);
    bVar26 = (byte)uVar13 & (byte)uVar14 & 0x7f;
    if (bVar26 == 0) {
      auVar56 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar86._16_16_ = DAT_01feed20._16_16_;
    }
    else {
      auVar65 = vsubps_avx512vl(auVar78,auVar131);
      auVar66 = vsubps_avx512vl(auVar80,auVar145);
      auVar85 = vsubps_avx512vl(auVar79,auVar84);
      auVar65 = vaddps_avx512vl(auVar65,auVar85);
      auVar85 = vsubps_avx512vl(auVar83,auVar90);
      auVar66 = vaddps_avx512vl(auVar66,auVar85);
      auVar85 = vmulps_avx512vl(auVar145,auVar65);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar66,auVar131);
      auVar82 = vmulps_avx512vl(auVar82,auVar65);
      auVar82 = vfnmadd213ps_avx512vl(auVar120,auVar66,auVar82);
      auVar81 = vmulps_avx512vl(auVar81,auVar65);
      auVar81 = vfnmadd213ps_avx512vl(auVar68,auVar66,auVar81);
      auVar68 = vmulps_avx512vl(auVar80,auVar65);
      auVar80 = vfnmadd231ps_avx512vl(auVar68,auVar66,auVar78);
      auVar68 = vmulps_avx512vl(auVar90,auVar65);
      auVar90 = vfnmadd231ps_avx512vl(auVar68,auVar66,auVar84);
      auVar68 = vmulps_avx512vl(auVar67,auVar65);
      auVar84 = vfnmadd213ps_avx512vl(auVar197,auVar66,auVar68);
      auVar68 = vmulps_avx512vl(auVar89,auVar65);
      auVar67 = vfnmadd213ps_avx512vl(auVar69,auVar66,auVar68);
      auVar69 = vmulps_avx512vl(auVar83,auVar65);
      auVar79 = vfnmadd231ps_avx512vl(auVar69,auVar79,auVar66);
      auVar68 = vminps_avx(auVar85,auVar82);
      auVar69 = vmaxps_avx(auVar85,auVar82);
      auVar78 = vminps_avx(auVar81,auVar80);
      auVar78 = vminps_avx(auVar68,auVar78);
      auVar68 = vmaxps_avx(auVar81,auVar80);
      auVar69 = vmaxps_avx(auVar69,auVar68);
      auVar89 = vminps_avx(auVar90,auVar84);
      auVar68 = vmaxps_avx(auVar90,auVar84);
      auVar90 = vminps_avx(auVar67,auVar79);
      auVar89 = vminps_avx(auVar89,auVar90);
      auVar89 = vminps_avx(auVar78,auVar89);
      auVar78 = vmaxps_avx(auVar67,auVar79);
      auVar68 = vmaxps_avx(auVar68,auVar78);
      auVar69 = vmaxps_avx(auVar69,auVar68);
      uVar13 = vcmpps_avx512vl(auVar69,auVar25,5);
      uVar14 = vcmpps_avx512vl(auVar89,local_d8,2);
      bVar26 = bVar26 & (byte)uVar13 & (byte)uVar14;
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      if (bVar26 != 0) {
        auStack_188[uVar28] = (uint)bVar26;
        uVar13 = vmovlps_avx(auVar42);
        (&uStack_b8)[uVar28] = uVar13;
        uVar1 = vmovlps_avx(auVar47);
        auStack_58[uVar28] = uVar1;
        uVar28 = (ulong)((int)uVar28 + 1);
      }
      auVar56 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar86._16_16_ = auVar69._16_16_;
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    }
    auVar247 = ZEXT1664(auVar42);
    auVar246 = ZEXT3264(_DAT_01feed20);
    auVar245 = ZEXT1664(auVar43);
    auVar244 = ZEXT1664(auVar57);
    auVar243 = ZEXT3264(auVar69);
    auVar242 = ZEXT1664(auVar56);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar251 = ZEXT1664(auVar42);
LAB_01e5505b:
    do {
      do {
        in_ZMM25 = ZEXT464(0x3eaaaaab);
        auVar43 = auVar242._0_16_;
        auVar56 = auVar247._0_16_;
        if ((int)uVar28 == 0) {
          if (bVar34) {
            return bVar34;
          }
          fVar214 = ray->tfar;
          auVar18._4_4_ = fVar214;
          auVar18._0_4_ = fVar214;
          auVar18._8_4_ = fVar214;
          auVar18._12_4_ = fVar214;
          auVar18._16_4_ = fVar214;
          auVar18._20_4_ = fVar214;
          auVar18._24_4_ = fVar214;
          auVar18._28_4_ = fVar214;
          uVar13 = vcmpps_avx512vl(local_98,auVar18,2);
          uVar37 = (uint)uVar36 & (uint)lVar35 & (uint)uVar13;
          uVar36 = (ulong)uVar37;
          if (uVar37 == 0) {
            return bVar34;
          }
          goto LAB_01e53fff;
        }
        uVar27 = (int)uVar28 - 1;
        uVar29 = (ulong)uVar27;
        uVar37 = auStack_188[uVar29];
        auVar47._8_8_ = 0;
        auVar47._0_8_ = auStack_58[uVar29];
        uVar1 = 0;
        for (uVar33 = (ulong)uVar37; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        uVar31 = uVar37 - 1 & uVar37;
        bVar40 = uVar31 == 0;
        auStack_188[uVar29] = uVar31;
        if (bVar40) {
          uVar28 = (ulong)uVar27;
        }
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar1;
        auVar42 = vpunpcklqdq_avx(auVar107,ZEXT416((int)uVar1 + 1));
        auVar42 = vcvtqq2ps_avx512vl(auVar42);
        auVar42 = vmulps_avx512vl(auVar42,auVar244._0_16_);
        uVar106 = *(undefined4 *)((long)&uStack_b8 + uVar29 * 8 + 4);
        auVar15._4_4_ = uVar106;
        auVar15._0_4_ = uVar106;
        auVar15._8_4_ = uVar106;
        auVar15._12_4_ = uVar106;
        auVar57 = vmulps_avx512vl(auVar42,auVar15);
        auVar61 = auVar245._0_16_;
        auVar42 = vsubps_avx512vl(auVar61,auVar42);
        uVar106 = *(undefined4 *)(&uStack_b8 + uVar29);
        auVar16._4_4_ = uVar106;
        auVar16._0_4_ = uVar106;
        auVar16._8_4_ = uVar106;
        auVar16._12_4_ = uVar106;
        auVar42 = vfmadd231ps_avx512vl(auVar57,auVar42,auVar16);
        auVar57 = vmovshdup_avx(auVar42);
        fVar214 = auVar57._0_4_ - auVar42._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar214));
        if (uVar37 == 0 || bVar40) goto LAB_01e54af3;
        auVar57 = vshufps_avx(auVar47,auVar47,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar214));
        auVar63 = vsubps_avx512vl(auVar61,auVar57);
        fVar198 = auVar57._0_4_;
        auVar140._0_4_ = fVar198 * (float)local_2e8._0_4_;
        fVar209 = auVar57._4_4_;
        auVar140._4_4_ = fVar209 * (float)local_2e8._4_4_;
        fVar210 = auVar57._8_4_;
        auVar140._8_4_ = fVar210 * fStack_2e0;
        fVar211 = auVar57._12_4_;
        auVar140._12_4_ = fVar211 * fStack_2dc;
        auVar153._0_4_ = fVar198 * (float)local_2f8._0_4_;
        auVar153._4_4_ = fVar209 * (float)local_2f8._4_4_;
        auVar153._8_4_ = fVar210 * fStack_2f0;
        auVar153._12_4_ = fVar211 * fStack_2ec;
        auVar159._0_4_ = fVar198 * (float)local_308._0_4_;
        auVar159._4_4_ = fVar209 * (float)local_308._4_4_;
        auVar159._8_4_ = fVar210 * fStack_300;
        auVar159._12_4_ = fVar211 * fStack_2fc;
        auVar122._0_4_ = fVar198 * (float)local_318._0_4_;
        auVar122._4_4_ = fVar209 * (float)local_318._4_4_;
        auVar122._8_4_ = fVar210 * fStack_310;
        auVar122._12_4_ = fVar211 * fStack_30c;
        auVar57 = vfmadd231ps_fma(auVar140,auVar63,local_2a8);
        auVar60 = vfmadd231ps_fma(auVar153,auVar63,local_2b8);
        auVar62 = vfmadd231ps_fma(auVar159,auVar63,local_2c8);
        auVar63 = vfmadd231ps_fma(auVar122,auVar63,local_2d8);
        auVar132._16_16_ = auVar57;
        auVar132._0_16_ = auVar57;
        auVar146._16_16_ = auVar60;
        auVar146._0_16_ = auVar60;
        auVar157._16_16_ = auVar62;
        auVar157._0_16_ = auVar62;
        auVar68 = vpermps_avx512vl(auVar246._0_32_,ZEXT1632(auVar42));
        auVar69 = vsubps_avx(auVar146,auVar132);
        auVar60 = vfmadd213ps_fma(auVar69,auVar68,auVar132);
        auVar69 = vsubps_avx(auVar157,auVar146);
        auVar44 = vfmadd213ps_fma(auVar69,auVar68,auVar146);
        auVar57 = vsubps_avx(auVar63,auVar62);
        auVar147._16_16_ = auVar57;
        auVar147._0_16_ = auVar57;
        auVar57 = vfmadd213ps_fma(auVar147,auVar68,auVar157);
        auVar69 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar60));
        auVar60 = vfmadd213ps_fma(auVar69,auVar68,ZEXT1632(auVar60));
        auVar69 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar44));
        auVar57 = vfmadd213ps_fma(auVar69,auVar68,ZEXT1632(auVar44));
        auVar69 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar60));
        auVar52 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar69,auVar68);
        auVar69 = vmulps_avx512vl(auVar69,auVar243._0_32_);
        auVar86._16_16_ = auVar69._16_16_;
        auVar57 = vmulss_avx512f(ZEXT416((uint)fVar214),in_ZMM25._0_16_);
        fVar198 = auVar57._0_4_;
        auVar160._0_8_ =
             CONCAT44(auVar52._4_4_ + fVar198 * auVar69._4_4_,
                      auVar52._0_4_ + fVar198 * auVar69._0_4_);
        auVar160._8_4_ = auVar52._8_4_ + fVar198 * auVar69._8_4_;
        auVar160._12_4_ = auVar52._12_4_ + fVar198 * auVar69._12_4_;
        auVar141._0_4_ = fVar198 * auVar69._16_4_;
        auVar141._4_4_ = fVar198 * auVar69._20_4_;
        auVar141._8_4_ = fVar198 * auVar69._24_4_;
        auVar141._12_4_ = fVar198 * auVar69._28_4_;
        auVar49 = vsubps_avx((undefined1  [16])0x0,auVar141);
        auVar44 = vshufpd_avx(auVar52,auVar52,3);
        auVar45 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar57 = vsubps_avx(auVar44,auVar52);
        auVar60 = vsubps_avx(auVar45,(undefined1  [16])0x0);
        auVar181._0_4_ = auVar57._0_4_ + auVar60._0_4_;
        auVar181._4_4_ = auVar57._4_4_ + auVar60._4_4_;
        auVar181._8_4_ = auVar57._8_4_ + auVar60._8_4_;
        auVar181._12_4_ = auVar57._12_4_ + auVar60._12_4_;
        auVar57 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar60 = vshufps_avx(auVar160,auVar160,0xb1);
        auVar62 = vshufps_avx(auVar49,auVar49,0xb1);
        auVar63 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar228._4_4_ = auVar181._0_4_;
        auVar228._0_4_ = auVar181._0_4_;
        auVar228._8_4_ = auVar181._0_4_;
        auVar228._12_4_ = auVar181._0_4_;
        auVar46 = vshufps_avx(auVar181,auVar181,0x55);
        fVar198 = auVar46._0_4_;
        auVar193._0_4_ = auVar57._0_4_ * fVar198;
        fVar209 = auVar46._4_4_;
        auVar193._4_4_ = auVar57._4_4_ * fVar209;
        fVar210 = auVar46._8_4_;
        auVar193._8_4_ = auVar57._8_4_ * fVar210;
        fVar211 = auVar46._12_4_;
        auVar193._12_4_ = auVar57._12_4_ * fVar211;
        auVar201._0_4_ = auVar60._0_4_ * fVar198;
        auVar201._4_4_ = auVar60._4_4_ * fVar209;
        auVar201._8_4_ = auVar60._8_4_ * fVar210;
        auVar201._12_4_ = auVar60._12_4_ * fVar211;
        auVar215._0_4_ = auVar62._0_4_ * fVar198;
        auVar215._4_4_ = auVar62._4_4_ * fVar209;
        auVar215._8_4_ = auVar62._8_4_ * fVar210;
        auVar215._12_4_ = auVar62._12_4_ * fVar211;
        auVar182._0_4_ = auVar63._0_4_ * fVar198;
        auVar182._4_4_ = auVar63._4_4_ * fVar209;
        auVar182._8_4_ = auVar63._8_4_ * fVar210;
        auVar182._12_4_ = auVar63._12_4_ * fVar211;
        auVar57 = vfmadd231ps_fma(auVar193,auVar228,auVar52);
        auVar60 = vfmadd231ps_fma(auVar201,auVar228,auVar160);
        auVar50 = vfmadd231ps_fma(auVar215,auVar228,auVar49);
        auVar51 = vfmadd231ps_fma(auVar182,(undefined1  [16])0x0,auVar228);
        auVar46 = vshufpd_avx(auVar57,auVar57,1);
        auVar48 = vshufpd_avx(auVar60,auVar60,1);
        auVar53 = vshufpd_avx512vl(auVar50,auVar50,1);
        auVar54 = vshufpd_avx512vl(auVar51,auVar51,1);
        in_ZMM17 = ZEXT1664(auVar54);
        auVar62 = vminss_avx(auVar57,auVar60);
        auVar57 = vmaxss_avx(auVar60,auVar57);
        auVar63 = vminss_avx(auVar50,auVar51);
        auVar60 = vmaxss_avx(auVar51,auVar50);
        auVar62 = vminss_avx(auVar62,auVar63);
        auVar57 = vmaxss_avx(auVar60,auVar57);
        auVar63 = vminss_avx(auVar46,auVar48);
        auVar60 = vmaxss_avx(auVar48,auVar46);
        auVar46 = vminss_avx512f(auVar53,auVar54);
        auVar48 = vmaxss_avx512f(auVar54,auVar53);
        auVar60 = vmaxss_avx(auVar48,auVar60);
        auVar63 = vminss_avx512f(auVar63,auVar46);
        auVar241 = ZEXT1664(auVar63);
        fVar209 = auVar60._0_4_;
        fVar198 = auVar57._0_4_;
        if (auVar62._0_4_ < 0.0001) {
          bVar41 = fVar209 == -0.0001;
          bVar38 = NAN(fVar209);
          if (fVar209 <= -0.0001) goto LAB_01e55284;
          break;
        }
LAB_01e55284:
        vucomiss_avx512f(auVar63);
        bVar41 = fVar209 <= -0.0001;
        bVar39 = -0.0001 < fVar198;
        bVar38 = bVar41;
        if (!bVar41) break;
        uVar13 = vcmpps_avx512vl(auVar62,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar14 = vcmpps_avx512vl(auVar63,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar26 = (byte)uVar13 & (byte)uVar14 & 1;
        bVar41 = bVar39 && bVar26 == 0;
        bVar38 = bVar39 && bVar26 == 0;
      } while (!bVar39 || bVar26 != 0);
      vcmpss_avx512f(auVar62,auVar43,1);
      auVar50 = auVar248._0_16_;
      uVar13 = vcmpss_avx512f(auVar57,auVar43,1);
      bVar39 = (bool)((byte)uVar13 & 1);
      auVar86._0_16_ = auVar50;
      iVar105 = auVar248._0_4_;
      auVar94._4_28_ = auVar86._4_28_;
      auVar94._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar105);
      vucomiss_avx512f(auVar94._0_16_);
      bVar38 = (bool)(!bVar41 | bVar38);
      bVar39 = bVar38 == false;
      auVar96._16_16_ = auVar86._16_16_;
      auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (uint)bVar38 * auVar242._0_4_ + (uint)!bVar38 * 0x7f800000;
      auVar48 = auVar95._0_16_;
      auVar98._16_16_ = auVar86._16_16_;
      auVar98._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar97._4_28_ = auVar98._4_28_;
      auVar97._0_4_ = (uint)bVar38 * auVar242._0_4_ + (uint)!bVar38 * -0x800000;
      auVar46 = auVar97._0_16_;
      uVar13 = vcmpss_avx512f(auVar63,auVar43,1);
      bVar41 = (bool)((byte)uVar13 & 1);
      auVar100._16_16_ = auVar86._16_16_;
      auVar100._0_16_ = auVar50;
      auVar99._4_28_ = auVar100._4_28_;
      auVar99._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * iVar105);
      auVar63 = vucomiss_avx512f(auVar99._0_16_);
      in_ZMM17 = ZEXT1664(auVar63);
      if ((bVar38) || (bVar39)) {
        auVar63 = vucomiss_avx512f(auVar62);
        if ((bVar38) || (bVar39)) {
          auVar51 = vxorps_avx512vl(auVar62,auVar251._0_16_);
          in_ZMM17 = ZEXT1664(auVar51);
          auVar62 = vsubss_avx512f(auVar63,auVar62);
          auVar62 = vdivss_avx512f(auVar51,auVar62);
          auVar63 = vsubss_avx512f(auVar50,auVar62);
          auVar63 = vfmadd213ss_avx512f(auVar63,auVar43,auVar62);
          auVar62 = auVar63;
        }
        else {
          auVar63 = vxorps_avx512vl(auVar63,auVar63);
          vucomiss_avx512f(auVar63);
          if ((bVar38) || (auVar62 = auVar50, bVar39)) {
            auVar63 = ZEXT416(0x7f800000);
            auVar62 = SUB6416(ZEXT464(0xff800000),0);
          }
        }
        auVar48 = vminss_avx512f(auVar48,auVar63);
        auVar46 = vmaxss_avx(auVar62,auVar46);
      }
      uVar13 = vcmpss_avx512f(auVar60,auVar43,1);
      bVar41 = (bool)((byte)uVar13 & 1);
      fVar210 = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * iVar105);
      auVar241 = ZEXT1664(local_288);
      if ((auVar94._0_4_ != fVar210) || (NAN(auVar94._0_4_) || NAN(fVar210))) {
        if ((fVar209 != fVar198) || (NAN(fVar209) || NAN(fVar198))) {
          auVar57 = vxorps_avx512vl(auVar57,auVar251._0_16_);
          auVar183._0_4_ = auVar57._0_4_ / (fVar209 - fVar198);
          auVar183._4_12_ = auVar57._4_12_;
          auVar57 = vsubss_avx512f(auVar50,auVar183);
          auVar57 = vfmadd213ss_avx512f(auVar57,auVar43,auVar183);
          auVar60 = auVar57;
        }
        else if ((fVar198 != 0.0) ||
                (auVar57 = auVar50, auVar60 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar198))) {
          auVar57 = SUB6416(ZEXT464(0xff800000),0);
          auVar60 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar48 = vminss_avx(auVar48,auVar60);
        auVar46 = vmaxss_avx(auVar57,auVar46);
      }
      bVar41 = auVar99._0_4_ != fVar210;
      auVar57 = vminss_avx512f(auVar48,auVar50);
      auVar102._16_16_ = auVar86._16_16_;
      auVar102._0_16_ = auVar48;
      auVar101._4_28_ = auVar102._4_28_;
      auVar101._0_4_ = (uint)bVar41 * auVar57._0_4_ + (uint)!bVar41 * auVar48._0_4_;
      auVar57 = vmaxss_avx512f(auVar50,auVar46);
      auVar104._16_16_ = auVar86._16_16_;
      auVar104._0_16_ = auVar46;
      auVar103._4_28_ = auVar104._4_28_;
      auVar103._0_4_ = (uint)bVar41 * auVar57._0_4_ + (uint)!bVar41 * auVar46._0_4_;
      auVar57 = vmaxss_avx512f(auVar43,auVar101._0_16_);
      auVar60 = vminss_avx512f(auVar103._0_16_,auVar50);
    } while (auVar60._0_4_ < auVar57._0_4_);
    auVar63 = vmaxss_avx512f(auVar43,ZEXT416((uint)(auVar57._0_4_ + -0.1)));
    auVar51 = vminss_avx512f(ZEXT416((uint)(auVar60._0_4_ + 0.1)),auVar50);
    auVar123._0_8_ = auVar52._0_8_;
    auVar123._8_8_ = auVar123._0_8_;
    auVar202._8_8_ = auVar160._0_8_;
    auVar202._0_8_ = auVar160._0_8_;
    auVar216._8_8_ = auVar49._0_8_;
    auVar216._0_8_ = auVar49._0_8_;
    auVar57 = vshufpd_avx(auVar160,auVar160,3);
    auVar60 = vshufpd_avx(auVar49,auVar49,3);
    auVar62 = vshufps_avx(auVar63,auVar51,0);
    auVar48 = vsubps_avx512vl(auVar61,auVar62);
    fVar198 = auVar62._0_4_;
    auVar154._0_4_ = fVar198 * auVar44._0_4_;
    fVar209 = auVar62._4_4_;
    auVar154._4_4_ = fVar209 * auVar44._4_4_;
    fVar210 = auVar62._8_4_;
    auVar154._8_4_ = fVar210 * auVar44._8_4_;
    fVar211 = auVar62._12_4_;
    auVar154._12_4_ = fVar211 * auVar44._12_4_;
    auVar161._0_4_ = fVar198 * auVar57._0_4_;
    auVar161._4_4_ = fVar209 * auVar57._4_4_;
    auVar161._8_4_ = fVar210 * auVar57._8_4_;
    auVar161._12_4_ = fVar211 * auVar57._12_4_;
    auVar235._0_4_ = auVar60._0_4_ * fVar198;
    auVar235._4_4_ = auVar60._4_4_ * fVar209;
    auVar235._8_4_ = auVar60._8_4_ * fVar210;
    auVar235._12_4_ = auVar60._12_4_ * fVar211;
    auVar142._0_4_ = fVar198 * auVar45._0_4_;
    auVar142._4_4_ = fVar209 * auVar45._4_4_;
    auVar142._8_4_ = fVar210 * auVar45._8_4_;
    auVar142._12_4_ = fVar211 * auVar45._12_4_;
    auVar44 = vfmadd231ps_fma(auVar154,auVar48,auVar123);
    auVar45 = vfmadd231ps_fma(auVar161,auVar48,auVar202);
    auVar46 = vfmadd231ps_fma(auVar235,auVar48,auVar216);
    auVar48 = vfmadd231ps_fma(auVar142,auVar48,ZEXT816(0));
    auVar60 = vsubss_avx512f(auVar50,auVar63);
    auVar57 = vmovshdup_avx(auVar47);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar63._0_4_)),auVar47,auVar60);
    auVar60 = vsubss_avx512f(auVar50,auVar51);
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar51._0_4_)),auVar47,auVar60);
    auVar47 = vdivss_avx512f(auVar50,ZEXT416((uint)fVar214));
    auVar57 = vsubps_avx(auVar45,auVar44);
    auVar62 = vmulps_avx512vl(auVar57,auVar56);
    auVar57 = vsubps_avx(auVar46,auVar45);
    auVar63 = vmulps_avx512vl(auVar57,auVar56);
    auVar57 = vsubps_avx(auVar48,auVar46);
    auVar57 = vmulps_avx512vl(auVar57,auVar56);
    auVar60 = vminps_avx(auVar63,auVar57);
    auVar57 = vmaxps_avx(auVar63,auVar57);
    auVar60 = vminps_avx(auVar62,auVar60);
    auVar57 = vmaxps_avx(auVar62,auVar57);
    auVar62 = vshufpd_avx(auVar60,auVar60,3);
    auVar63 = vshufpd_avx(auVar57,auVar57,3);
    auVar60 = vminps_avx(auVar60,auVar62);
    auVar57 = vmaxps_avx(auVar57,auVar63);
    fVar214 = auVar47._0_4_;
    auVar184._0_4_ = auVar60._0_4_ * fVar214;
    auVar184._4_4_ = auVar60._4_4_ * fVar214;
    auVar184._8_4_ = auVar60._8_4_ * fVar214;
    auVar184._12_4_ = auVar60._12_4_ * fVar214;
    auVar172._0_4_ = fVar214 * auVar57._0_4_;
    auVar172._4_4_ = fVar214 * auVar57._4_4_;
    auVar172._8_4_ = fVar214 * auVar57._8_4_;
    auVar172._12_4_ = fVar214 * auVar57._12_4_;
    auVar49 = vdivss_avx512f(auVar50,ZEXT416((uint)(auVar53._0_4_ - auVar52._0_4_)));
    auVar57 = vshufpd_avx(auVar44,auVar44,3);
    auVar60 = vshufpd_avx(auVar45,auVar45,3);
    auVar62 = vshufpd_avx(auVar46,auVar46,3);
    auVar63 = vshufpd_avx(auVar48,auVar48,3);
    auVar57 = vsubps_avx(auVar57,auVar44);
    auVar44 = vsubps_avx(auVar60,auVar45);
    auVar47 = vsubps_avx(auVar62,auVar46);
    auVar63 = vsubps_avx(auVar63,auVar48);
    auVar60 = vminps_avx(auVar57,auVar44);
    auVar57 = vmaxps_avx(auVar57,auVar44);
    auVar62 = vminps_avx(auVar47,auVar63);
    auVar62 = vminps_avx(auVar60,auVar62);
    auVar60 = vmaxps_avx(auVar47,auVar63);
    auVar57 = vmaxps_avx(auVar57,auVar60);
    fVar214 = auVar49._0_4_;
    auVar217._0_4_ = fVar214 * auVar62._0_4_;
    auVar217._4_4_ = fVar214 * auVar62._4_4_;
    auVar217._8_4_ = fVar214 * auVar62._8_4_;
    auVar217._12_4_ = fVar214 * auVar62._12_4_;
    auVar203._0_4_ = fVar214 * auVar57._0_4_;
    auVar203._4_4_ = fVar214 * auVar57._4_4_;
    auVar203._8_4_ = fVar214 * auVar57._8_4_;
    auVar203._12_4_ = fVar214 * auVar57._12_4_;
    auVar63 = vinsertps_avx(auVar42,auVar52,0x10);
    auVar54 = vpermt2ps_avx512vl(auVar42,_DAT_01feecd0,auVar53);
    auVar112._0_4_ = auVar63._0_4_ + auVar54._0_4_;
    auVar112._4_4_ = auVar63._4_4_ + auVar54._4_4_;
    auVar112._8_4_ = auVar63._8_4_ + auVar54._8_4_;
    auVar112._12_4_ = auVar63._12_4_ + auVar54._12_4_;
    auVar17._8_4_ = 0x3f000000;
    auVar17._0_8_ = 0x3f0000003f000000;
    auVar17._12_4_ = 0x3f000000;
    auVar48 = vmulps_avx512vl(auVar112,auVar17);
    auVar60 = vshufps_avx(auVar48,auVar48,0x54);
    uVar106 = auVar48._0_4_;
    auVar115._4_4_ = uVar106;
    auVar115._0_4_ = uVar106;
    auVar115._8_4_ = uVar106;
    auVar115._12_4_ = uVar106;
    auVar44 = vfmadd213ps_avx512vl(local_e8,auVar115,auVar249._0_16_);
    auVar62 = vfmadd213ps_fma(local_f8,auVar115,local_298);
    auVar47 = vfmadd213ps_avx512vl(local_108,auVar115,local_288);
    auVar57 = vsubps_avx(auVar62,auVar44);
    auVar44 = vfmadd213ps_fma(auVar57,auVar115,auVar44);
    auVar57 = vsubps_avx(auVar47,auVar62);
    auVar57 = vfmadd213ps_fma(auVar57,auVar115,auVar62);
    auVar57 = vsubps_avx(auVar57,auVar44);
    auVar62 = vfmadd231ps_fma(auVar44,auVar57,auVar115);
    auVar45 = vmulps_avx512vl(auVar57,auVar56);
    auVar222._8_8_ = auVar62._0_8_;
    auVar222._0_8_ = auVar62._0_8_;
    auVar57 = vshufpd_avx(auVar62,auVar62,3);
    auVar62 = vshufps_avx(auVar48,auVar48,0x55);
    auVar44 = vsubps_avx(auVar57,auVar222);
    auVar47 = vfmadd231ps_fma(auVar222,auVar62,auVar44);
    auVar236._8_8_ = auVar45._0_8_;
    auVar236._0_8_ = auVar45._0_8_;
    auVar57 = vshufpd_avx(auVar45,auVar45,3);
    auVar57 = vsubps_avx512vl(auVar57,auVar236);
    auVar57 = vfmadd213ps_avx512vl(auVar57,auVar62,auVar236);
    auVar116._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
    auVar116._8_4_ = auVar44._8_4_ ^ 0x80000000;
    auVar116._12_4_ = auVar44._12_4_ ^ 0x80000000;
    auVar62 = vmovshdup_avx512vl(auVar57);
    auVar237._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
    auVar237._8_4_ = auVar62._8_4_ ^ 0x80000000;
    auVar237._12_4_ = auVar62._12_4_ ^ 0x80000000;
    auVar45 = vmovshdup_avx512vl(auVar44);
    auVar46 = vpermt2ps_avx512vl(auVar237,ZEXT416(5),auVar44);
    auVar62 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar62._0_4_ * auVar44._0_4_)),auVar57,auVar45);
    auVar44 = vpermt2ps_avx512vl(auVar57,SUB6416(ZEXT464(4),0),auVar116);
    auVar143._0_4_ = auVar62._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar57 = vdivps_avx(auVar46,auVar143);
    auVar55 = vdivps_avx512vl(auVar44,auVar143);
    fVar214 = auVar47._0_4_;
    auVar62 = vshufps_avx(auVar47,auVar47,0x55);
    auVar223._0_4_ = fVar214 * auVar57._0_4_ + auVar62._0_4_ * auVar55._0_4_;
    auVar223._4_4_ = fVar214 * auVar57._4_4_ + auVar62._4_4_ * auVar55._4_4_;
    auVar223._8_4_ = fVar214 * auVar57._8_4_ + auVar62._8_4_ * auVar55._8_4_;
    auVar223._12_4_ = fVar214 * auVar57._12_4_ + auVar62._12_4_ * auVar55._12_4_;
    auVar49 = vsubps_avx(auVar60,auVar223);
    auVar62 = vmovshdup_avx(auVar57);
    auVar60 = vinsertps_avx(auVar184,auVar217,0x1c);
    auVar238._0_4_ = auVar62._0_4_ * auVar60._0_4_;
    auVar238._4_4_ = auVar62._4_4_ * auVar60._4_4_;
    auVar238._8_4_ = auVar62._8_4_ * auVar60._8_4_;
    auVar238._12_4_ = auVar62._12_4_ * auVar60._12_4_;
    auVar51 = vinsertps_avx512f(auVar172,auVar203,0x1c);
    auVar62 = vmulps_avx512vl(auVar62,auVar51);
    auVar46 = vminps_avx512vl(auVar238,auVar62);
    auVar47 = vmaxps_avx(auVar62,auVar238);
    auVar45 = vmovshdup_avx(auVar55);
    auVar62 = vinsertps_avx(auVar217,auVar184,0x4c);
    auVar218._0_4_ = auVar45._0_4_ * auVar62._0_4_;
    auVar218._4_4_ = auVar45._4_4_ * auVar62._4_4_;
    auVar218._8_4_ = auVar45._8_4_ * auVar62._8_4_;
    auVar218._12_4_ = auVar45._12_4_ * auVar62._12_4_;
    auVar44 = vinsertps_avx(auVar203,auVar172,0x4c);
    auVar204._0_4_ = auVar45._0_4_ * auVar44._0_4_;
    auVar204._4_4_ = auVar45._4_4_ * auVar44._4_4_;
    auVar204._8_4_ = auVar45._8_4_ * auVar44._8_4_;
    auVar204._12_4_ = auVar45._12_4_ * auVar44._12_4_;
    auVar45 = vminps_avx(auVar218,auVar204);
    auVar46 = vaddps_avx512vl(auVar46,auVar45);
    auVar45 = vmaxps_avx(auVar204,auVar218);
    auVar205._0_4_ = auVar47._0_4_ + auVar45._0_4_;
    auVar205._4_4_ = auVar47._4_4_ + auVar45._4_4_;
    auVar205._8_4_ = auVar47._8_4_ + auVar45._8_4_;
    auVar205._12_4_ = auVar47._12_4_ + auVar45._12_4_;
    auVar219._8_8_ = 0x3f80000000000000;
    auVar219._0_8_ = 0x3f80000000000000;
    auVar47 = vsubps_avx(auVar219,auVar205);
    auVar45 = vsubps_avx(auVar219,auVar46);
    auVar46 = vsubps_avx(auVar63,auVar48);
    auVar48 = vsubps_avx(auVar54,auVar48);
    fVar211 = auVar46._0_4_;
    auVar239._0_4_ = fVar211 * auVar47._0_4_;
    fVar212 = auVar46._4_4_;
    auVar239._4_4_ = fVar212 * auVar47._4_4_;
    fVar213 = auVar46._8_4_;
    auVar239._8_4_ = fVar213 * auVar47._8_4_;
    fVar111 = auVar46._12_4_;
    auVar239._12_4_ = fVar111 * auVar47._12_4_;
    auVar58 = vbroadcastss_avx512vl(auVar57);
    auVar60 = vmulps_avx512vl(auVar58,auVar60);
    auVar51 = vmulps_avx512vl(auVar58,auVar51);
    auVar58 = vminps_avx512vl(auVar60,auVar51);
    auVar51 = vmaxps_avx512vl(auVar51,auVar60);
    auVar60 = vbroadcastss_avx512vl(auVar55);
    auVar62 = vmulps_avx512vl(auVar60,auVar62);
    auVar60 = vmulps_avx512vl(auVar60,auVar44);
    auVar44 = vminps_avx512vl(auVar62,auVar60);
    auVar44 = vaddps_avx512vl(auVar58,auVar44);
    auVar46 = vmulps_avx512vl(auVar46,auVar45);
    in_ZMM17 = ZEXT1664(auVar46);
    fVar214 = auVar48._0_4_;
    auVar206._0_4_ = fVar214 * auVar47._0_4_;
    fVar198 = auVar48._4_4_;
    auVar206._4_4_ = fVar198 * auVar47._4_4_;
    fVar209 = auVar48._8_4_;
    auVar206._8_4_ = fVar209 * auVar47._8_4_;
    fVar210 = auVar48._12_4_;
    auVar206._12_4_ = fVar210 * auVar47._12_4_;
    auVar220._0_4_ = fVar214 * auVar45._0_4_;
    auVar220._4_4_ = fVar198 * auVar45._4_4_;
    auVar220._8_4_ = fVar209 * auVar45._8_4_;
    auVar220._12_4_ = fVar210 * auVar45._12_4_;
    auVar60 = vmaxps_avx(auVar60,auVar62);
    auVar173._0_4_ = auVar51._0_4_ + auVar60._0_4_;
    auVar173._4_4_ = auVar51._4_4_ + auVar60._4_4_;
    auVar173._8_4_ = auVar51._8_4_ + auVar60._8_4_;
    auVar173._12_4_ = auVar51._12_4_ + auVar60._12_4_;
    auVar185._8_8_ = 0x3f800000;
    auVar185._0_8_ = 0x3f800000;
    auVar60 = vsubps_avx(auVar185,auVar173);
    auVar62 = vsubps_avx512vl(auVar185,auVar44);
    auVar229._0_4_ = fVar211 * auVar60._0_4_;
    auVar229._4_4_ = fVar212 * auVar60._4_4_;
    auVar229._8_4_ = fVar213 * auVar60._8_4_;
    auVar229._12_4_ = fVar111 * auVar60._12_4_;
    auVar224._0_4_ = fVar211 * auVar62._0_4_;
    auVar224._4_4_ = fVar212 * auVar62._4_4_;
    auVar224._8_4_ = fVar213 * auVar62._8_4_;
    auVar224._12_4_ = fVar111 * auVar62._12_4_;
    auVar174._0_4_ = fVar214 * auVar60._0_4_;
    auVar174._4_4_ = fVar198 * auVar60._4_4_;
    auVar174._8_4_ = fVar209 * auVar60._8_4_;
    auVar174._12_4_ = fVar210 * auVar60._12_4_;
    auVar186._0_4_ = fVar214 * auVar62._0_4_;
    auVar186._4_4_ = fVar198 * auVar62._4_4_;
    auVar186._8_4_ = fVar209 * auVar62._8_4_;
    auVar186._12_4_ = fVar210 * auVar62._12_4_;
    auVar60 = vminps_avx(auVar229,auVar224);
    auVar62 = vminps_avx512vl(auVar174,auVar186);
    auVar241 = ZEXT1664(auVar62);
    auVar44 = vminps_avx512vl(auVar60,auVar62);
    auVar60 = vmaxps_avx(auVar224,auVar229);
    auVar62 = vmaxps_avx(auVar186,auVar174);
    auVar62 = vmaxps_avx(auVar62,auVar60);
    auVar47 = vminps_avx512vl(auVar239,auVar46);
    auVar60 = vminps_avx(auVar206,auVar220);
    auVar60 = vminps_avx(auVar47,auVar60);
    auVar60 = vhaddps_avx(auVar44,auVar60);
    auVar47 = vmaxps_avx512vl(auVar46,auVar239);
    auVar44 = vmaxps_avx(auVar220,auVar206);
    auVar44 = vmaxps_avx(auVar44,auVar47);
    auVar62 = vhaddps_avx(auVar62,auVar44);
    auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
    auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
    auVar175._0_4_ = auVar60._0_4_ + auVar49._0_4_;
    auVar175._4_4_ = auVar60._4_4_ + auVar49._4_4_;
    auVar175._8_4_ = auVar60._8_4_ + auVar49._8_4_;
    auVar175._12_4_ = auVar60._12_4_ + auVar49._12_4_;
    auVar187._0_4_ = auVar62._0_4_ + auVar49._0_4_;
    auVar187._4_4_ = auVar62._4_4_ + auVar49._4_4_;
    auVar187._8_4_ = auVar62._8_4_ + auVar49._8_4_;
    auVar187._12_4_ = auVar62._12_4_ + auVar49._12_4_;
    auVar60 = vmaxps_avx(auVar63,auVar175);
    auVar62 = vminps_avx(auVar187,auVar54);
    uVar1 = vcmpps_avx512vl(auVar62,auVar60,1);
    if ((uVar1 & 3) != 0) {
      auVar249 = ZEXT1664(local_338);
      goto LAB_01e5505b;
    }
    uVar1 = vcmpps_avx512vl(auVar187,auVar54,1);
    uVar13 = vcmpps_avx512vl(auVar42,auVar175,1);
    if (((ushort)uVar13 & (ushort)uVar1 & 1) == 0) {
      bVar26 = 0;
    }
    else {
      auVar60 = vmovshdup_avx(auVar175);
      bVar26 = auVar52._0_4_ < auVar60._0_4_ & (byte)(uVar1 >> 1) & 0x7f;
    }
    auVar249 = ZEXT1664(local_338);
    if (((3 < (uint)uVar28 || uVar37 != 0 && !bVar40) | bVar26) == 1) {
      lVar30 = 200;
      do {
        auVar42 = vsubss_avx512f(auVar50,auVar49);
        fVar209 = auVar42._0_4_;
        fVar214 = fVar209 * fVar209 * fVar209;
        fVar210 = auVar49._0_4_;
        fVar198 = fVar210 * 3.0 * fVar209 * fVar209;
        fVar209 = fVar209 * fVar210 * fVar210 * 3.0;
        auVar129._4_4_ = fVar214;
        auVar129._0_4_ = fVar214;
        auVar129._8_4_ = fVar214;
        auVar129._12_4_ = fVar214;
        auVar124._4_4_ = fVar198;
        auVar124._0_4_ = fVar198;
        auVar124._8_4_ = fVar198;
        auVar124._12_4_ = fVar198;
        auVar108._4_4_ = fVar209;
        auVar108._0_4_ = fVar209;
        auVar108._8_4_ = fVar209;
        auVar108._12_4_ = fVar209;
        fVar210 = fVar210 * fVar210 * fVar210;
        auVar155._0_4_ = (float)local_198._0_4_ * fVar210;
        auVar155._4_4_ = (float)local_198._4_4_ * fVar210;
        auVar155._8_4_ = fStack_190 * fVar210;
        auVar155._12_4_ = fStack_18c * fVar210;
        auVar42 = vfmadd231ps_fma(auVar155,local_288,auVar108);
        auVar42 = vfmadd231ps_fma(auVar42,local_298,auVar124);
        auVar42 = vfmadd231ps_avx512vl(auVar42,local_338,auVar129);
        auVar109._8_8_ = auVar42._0_8_;
        auVar109._0_8_ = auVar42._0_8_;
        auVar42 = vshufpd_avx(auVar42,auVar42,3);
        auVar60 = vshufps_avx(auVar49,auVar49,0x55);
        auVar42 = vsubps_avx(auVar42,auVar109);
        auVar60 = vfmadd213ps_fma(auVar42,auVar60,auVar109);
        fVar214 = auVar60._0_4_;
        auVar42 = vshufps_avx(auVar60,auVar60,0x55);
        auVar110._0_4_ = auVar57._0_4_ * fVar214 + auVar55._0_4_ * auVar42._0_4_;
        auVar110._4_4_ = auVar57._4_4_ * fVar214 + auVar55._4_4_ * auVar42._4_4_;
        auVar110._8_4_ = auVar57._8_4_ * fVar214 + auVar55._8_4_ * auVar42._8_4_;
        auVar110._12_4_ = auVar57._12_4_ * fVar214 + auVar55._12_4_ * auVar42._12_4_;
        auVar49 = vsubps_avx(auVar49,auVar110);
        auVar42 = vandps_avx512vl(auVar60,auVar250._0_16_);
        auVar60 = vprolq_avx512vl(auVar42,0x20);
        auVar42 = vmaxss_avx(auVar60,auVar42);
        bVar40 = auVar42._0_4_ <= (float)local_1a8._0_4_;
        if (auVar42._0_4_ < (float)local_1a8._0_4_) {
          auVar42 = vucomiss_avx512f(auVar43);
          if (bVar40) {
            auVar57 = vucomiss_avx512f(auVar42);
            auVar248 = ZEXT1664(auVar57);
            if (bVar40) {
              vmovshdup_avx(auVar42);
              auVar57 = vucomiss_avx512f(auVar43);
              if (bVar40) {
                auVar60 = vucomiss_avx512f(auVar57);
                auVar248 = ZEXT1664(auVar60);
                if (bVar40) {
                  auVar62 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
                  auVar49 = vinsertps_avx(auVar62,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2])
                                          ,0x28);
                  aVar2 = (ray->org).field_0;
                  auVar62 = vsubps_avx(local_1b8,(undefined1  [16])aVar2);
                  auVar62 = vdpps_avx(auVar62,auVar49,0x7f);
                  auVar63 = vsubps_avx(local_1c8,(undefined1  [16])aVar2);
                  auVar63 = vdpps_avx(auVar63,auVar49,0x7f);
                  auVar44 = vsubps_avx(local_1d8,(undefined1  [16])aVar2);
                  auVar44 = vdpps_avx(auVar44,auVar49,0x7f);
                  auVar47 = vsubps_avx(local_1e8,(undefined1  [16])aVar2);
                  auVar47 = vdpps_avx(auVar47,auVar49,0x7f);
                  auVar45 = vsubps_avx(_local_1f8,(undefined1  [16])aVar2);
                  auVar45 = vdpps_avx(auVar45,auVar49,0x7f);
                  auVar46 = vsubps_avx(_local_208,(undefined1  [16])aVar2);
                  auVar46 = vdpps_avx(auVar46,auVar49,0x7f);
                  auVar48 = vsubps_avx(_local_218,(undefined1  [16])aVar2);
                  auVar48 = vdpps_avx(auVar48,auVar49,0x7f);
                  auVar50 = vsubps_avx(_local_228,(undefined1  [16])aVar2);
                  auVar49 = vdpps_avx(auVar50,auVar49,0x7f);
                  auVar50 = vsubss_avx512f(auVar60,auVar57);
                  fVar214 = auVar57._0_4_;
                  auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar214)),auVar50,auVar62
                                           );
                  auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar214)),auVar50,auVar63
                                           );
                  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * fVar214)),auVar50,auVar44
                                           );
                  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar49._0_4_)),auVar50,auVar47
                                           );
                  auVar60 = vsubss_avx512f(auVar60,auVar42);
                  auVar156._0_4_ = auVar60._0_4_;
                  fVar214 = auVar156._0_4_ * auVar156._0_4_ * auVar156._0_4_;
                  fVar211 = auVar42._0_4_;
                  fVar198 = fVar211 * 3.0 * auVar156._0_4_ * auVar156._0_4_;
                  fVar209 = auVar156._0_4_ * fVar211 * fVar211 * 3.0;
                  fVar212 = fVar211 * fVar211 * fVar211;
                  auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar44._0_4_)),
                                            ZEXT416((uint)fVar209),auVar63);
                  auVar60 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar198),auVar62);
                  auVar57 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar214),auVar57);
                  fVar210 = auVar57._0_4_;
                  if (((ray->org).field_0.m128[3] <= fVar210) &&
                     (fVar213 = ray->tfar, fVar210 <= fVar213)) {
                    auVar57 = vshufps_avx(auVar42,auVar42,0x55);
                    auVar62 = vsubps_avx512vl(auVar61,auVar57);
                    fVar111 = auVar57._0_4_;
                    auVar188._0_4_ = fVar111 * (float)local_1f8._0_4_;
                    fVar113 = auVar57._4_4_;
                    auVar188._4_4_ = fVar113 * (float)local_1f8._4_4_;
                    fVar121 = auVar57._8_4_;
                    auVar188._8_4_ = fVar121 * fStack_1f0;
                    fVar167 = auVar57._12_4_;
                    auVar188._12_4_ = fVar167 * fStack_1ec;
                    auVar194._0_4_ = fVar111 * (float)local_208._0_4_;
                    auVar194._4_4_ = fVar113 * (float)local_208._4_4_;
                    auVar194._8_4_ = fVar121 * fStack_200;
                    auVar194._12_4_ = fVar167 * fStack_1fc;
                    auVar207._0_4_ = fVar111 * (float)local_218._0_4_;
                    auVar207._4_4_ = fVar113 * (float)local_218._4_4_;
                    auVar207._8_4_ = fVar121 * fStack_210;
                    auVar207._12_4_ = fVar167 * fStack_20c;
                    auVar162._0_4_ = fVar111 * (float)local_228._0_4_;
                    auVar162._4_4_ = fVar113 * (float)local_228._4_4_;
                    auVar162._8_4_ = fVar121 * fStack_220;
                    auVar162._12_4_ = fVar167 * fStack_21c;
                    auVar57 = vfmadd231ps_fma(auVar188,auVar62,local_1b8);
                    auVar61 = vfmadd231ps_fma(auVar194,auVar62,local_1c8);
                    auVar60 = vfmadd231ps_fma(auVar207,auVar62,local_1d8);
                    auVar62 = vfmadd231ps_fma(auVar162,auVar62,local_1e8);
                    auVar57 = vsubps_avx(auVar61,auVar57);
                    auVar61 = vsubps_avx(auVar60,auVar61);
                    auVar60 = vsubps_avx(auVar62,auVar60);
                    auVar208._0_4_ = fVar211 * auVar61._0_4_;
                    auVar208._4_4_ = fVar211 * auVar61._4_4_;
                    auVar208._8_4_ = fVar211 * auVar61._8_4_;
                    auVar208._12_4_ = fVar211 * auVar61._12_4_;
                    auVar156._4_4_ = auVar156._0_4_;
                    auVar156._8_4_ = auVar156._0_4_;
                    auVar156._12_4_ = auVar156._0_4_;
                    auVar57 = vfmadd231ps_fma(auVar208,auVar156,auVar57);
                    auVar163._0_4_ = fVar211 * auVar60._0_4_;
                    auVar163._4_4_ = fVar211 * auVar60._4_4_;
                    auVar163._8_4_ = fVar211 * auVar60._8_4_;
                    auVar163._12_4_ = fVar211 * auVar60._12_4_;
                    auVar61 = vfmadd231ps_fma(auVar163,auVar156,auVar61);
                    auVar164._0_4_ = fVar211 * auVar61._0_4_;
                    auVar164._4_4_ = fVar211 * auVar61._4_4_;
                    auVar164._8_4_ = fVar211 * auVar61._8_4_;
                    auVar164._12_4_ = fVar211 * auVar61._12_4_;
                    auVar57 = vfmadd231ps_fma(auVar164,auVar156,auVar57);
                    auVar56 = vmulps_avx512vl(auVar57,auVar56);
                    pGVar6 = (context->scene->geometries).items[local_320].ptr;
                    if ((pGVar6->mask & ray->mask) == 0) {
LAB_01e55e49:
                      bVar26 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar26 = 1, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar144._0_4_ = fVar212 * (float)local_148._0_4_;
                      auVar144._4_4_ = fVar212 * (float)local_148._4_4_;
                      auVar144._8_4_ = fVar212 * fStack_140;
                      auVar144._12_4_ = fVar212 * fStack_13c;
                      auVar130._4_4_ = fVar209;
                      auVar130._0_4_ = fVar209;
                      auVar130._8_4_ = fVar209;
                      auVar130._12_4_ = fVar209;
                      auVar57 = vfmadd132ps_fma(auVar130,auVar144,local_138);
                      auVar125._4_4_ = fVar198;
                      auVar125._0_4_ = fVar198;
                      auVar125._8_4_ = fVar198;
                      auVar125._12_4_ = fVar198;
                      auVar57 = vfmadd132ps_fma(auVar125,auVar57,local_128);
                      auVar117._4_4_ = fVar214;
                      auVar117._0_4_ = fVar214;
                      auVar117._8_4_ = fVar214;
                      auVar117._12_4_ = fVar214;
                      auVar60 = vfmadd132ps_fma(auVar117,auVar57,local_118);
                      auVar57 = vshufps_avx(auVar60,auVar60,0xc9);
                      auVar61 = vshufps_avx(auVar56,auVar56,0xc9);
                      auVar118._0_4_ = auVar60._0_4_ * auVar61._0_4_;
                      auVar118._4_4_ = auVar60._4_4_ * auVar61._4_4_;
                      auVar118._8_4_ = auVar60._8_4_ * auVar61._8_4_;
                      auVar118._12_4_ = auVar60._12_4_ * auVar61._12_4_;
                      auVar57 = vfmsub231ps_fma(auVar118,auVar56,auVar57);
                      auVar56 = vshufps_avx(auVar57,auVar57,0xe9);
                      local_178 = vmovlps_avx(auVar56);
                      local_170 = auVar57._0_4_;
                      local_16c = vmovlps_avx(auVar42);
                      local_164 = (int)local_268;
                      local_160 = (int)local_320;
                      local_15c = context->user->instID[0];
                      local_158 = context->user->instPrimID[0];
                      ray->tfar = fVar210;
                      local_33c = -1;
                      local_258.valid = &local_33c;
                      local_258.geometryUserPtr = pGVar6->userPtr;
                      local_258.context = context->user;
                      local_258.hit = (RTCHitN *)&local_178;
                      local_258.N = 1;
                      local_258.ray = (RTCRayN *)ray;
                      if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        local_270 = lVar35;
                        (*pGVar6->occlusionFilterN)(&local_258);
                        auVar249 = ZEXT1664(local_338);
                        auVar246 = ZEXT3264(_DAT_01feed20);
                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar245 = ZEXT1664(auVar42);
                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar244 = ZEXT1664(auVar42);
                        auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar243 = ZEXT3264(auVar69);
                        auVar86._16_16_ = auVar69._16_16_;
                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar251 = ZEXT1664(auVar42);
                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar250 = ZEXT1664(auVar42);
                        auVar248 = ZEXT464(0x3f800000);
                        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar247 = ZEXT1664(auVar42);
                        auVar42 = vxorps_avx512vl(auVar43,auVar43);
                        auVar242 = ZEXT1664(auVar42);
                        lVar35 = local_270;
                        if (*local_258.valid != 0) goto LAB_01e55d62;
LAB_01e55e3d:
                        auVar248 = ZEXT464(0x3f800000);
                        ray->tfar = fVar213;
                        goto LAB_01e55e49;
                      }
LAB_01e55d62:
                      auVar42 = auVar242._0_16_;
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_258);
                        auVar249 = ZEXT1664(local_338);
                        auVar246 = ZEXT3264(_DAT_01feed20);
                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar245 = ZEXT1664(auVar43);
                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar244 = ZEXT1664(auVar43);
                        auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar243 = ZEXT3264(auVar69);
                        auVar86._16_16_ = auVar69._16_16_;
                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar251 = ZEXT1664(auVar43);
                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar250 = ZEXT1664(auVar43);
                        auVar248 = ZEXT464(0x3f800000);
                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar247 = ZEXT1664(auVar43);
                        auVar42 = vxorps_avx512vl(auVar42,auVar42);
                        auVar242 = ZEXT1664(auVar42);
                        if (*local_258.valid == 0) goto LAB_01e55e3d;
                      }
                      bVar26 = 1;
                    }
                    bVar34 = (bool)(bVar34 | bVar26);
                  }
                }
              }
            }
          }
          break;
        }
        lVar30 = lVar30 + -1;
      } while (lVar30 != 0);
      goto LAB_01e5505b;
    }
    auVar47 = vinsertps_avx(auVar52,auVar53,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }